

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

vbool<4> __thiscall
embree::avx2::InstanceArrayIntersectorKMB<4>::occluded
          (InstanceArrayIntersectorKMB<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RawBufferView *pRVar1;
  RTCRayQueryContext RVar2;
  int iVar3;
  RTCFormat RVar4;
  InstanceArray *this_00;
  RTCRayQueryContext *pRVar5;
  RawBufferView *pRVar6;
  char *pcVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar16;
  undefined8 uVar17;
  Accel *pAVar18;
  ulong uVar19;
  uint uVar20;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar137;
  float fVar160;
  float fVar161;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar162;
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 in_ZMM4 [64];
  float fVar204;
  float fVar205;
  float fVar225;
  float fVar227;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar229;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar226;
  float fVar228;
  float fVar230;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar318;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 in_ZMM14 [64];
  float fVar339;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  float fVar349;
  undefined1 auVar342 [16];
  float fVar350;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar347;
  float fVar348;
  undefined1 in_ZMM15 [64];
  vbool<4> vVar351;
  RayQueryContext newcontext;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  undefined1 local_338 [8];
  undefined8 uStack_330;
  undefined1 local_328 [8];
  undefined8 uStack_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_158 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  RTCIntersectArguments *local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uVar21;
  
  auVar81 = in_ZMM8._0_16_;
  aVar16 = valid_i->field_0;
  this_00 = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar18 = InstanceArray::getObject(this_00,(ulong)prim->primID_);
  uVar17 = mm_lookupmask_ps._8_8_;
  auVar39 = in_ZMM13._0_16_;
  auVar37 = in_ZMM10._0_16_;
  auVar38 = in_ZMM14._0_16_;
  uVar21 = extraout_RDX;
  if (pAVar18 != (Accel *)0x0) {
    uVar20 = (this_00->super_Geometry).mask;
    auVar24._4_4_ = uVar20;
    auVar24._0_4_ = uVar20;
    auVar24._8_4_ = uVar20;
    auVar24._12_4_ = uVar20;
    auVar24 = vpand_avx(auVar24,*(undefined1 (*) [16])(ray + 0x90));
    auVar24 = vpcmpeqd_avx(auVar24,(undefined1  [16])0x0);
    local_58 = vpandn_avx(auVar24,(undefined1  [16])aVar16);
    uVar20 = vmovmskps_avx(local_58);
    uVar21 = CONCAT44((int)((ulong)extraout_RDX >> 0x20),uVar20);
    if (uVar20 != 0) {
      pRVar5 = context->user;
      *(undefined8 *)this = mm_lookupmask_ps._0_8_;
      *(undefined8 *)(this + 8) = uVar17;
      if (pRVar5->instID[0] == 0xffffffff) {
        auVar25._8_8_ = 0;
        auVar25._0_4_ = prim->primID_;
        auVar25._4_4_ = prim->instID_;
        auVar24 = vshufps_avx(auVar25,auVar25,0xe1);
        RVar2 = (RTCRayQueryContext)vmovlps_avx(auVar24);
        *pRVar5 = RVar2;
        uVar19 = (ulong)prim->primID_;
        auVar24 = local_58;
        if ((this_00->super_Geometry).field_8.field_0x1 == '\x01') {
          fVar137 = (this_00->super_Geometry).time_range.lower;
          auVar37._4_4_ = fVar137;
          auVar37._0_4_ = fVar137;
          auVar37._8_4_ = fVar137;
          auVar37._12_4_ = fVar137;
          fVar160 = (this_00->super_Geometry).fnumTimeSegments;
          auVar81 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar37);
          fVar137 = (this_00->super_Geometry).time_range.upper - fVar137;
          auVar38._4_4_ = fVar137;
          auVar38._0_4_ = fVar137;
          auVar38._8_4_ = fVar137;
          auVar38._12_4_ = fVar137;
          auVar37 = vdivps_avx(auVar81,auVar38);
          auVar39._0_4_ = fVar160 * auVar37._0_4_;
          auVar39._4_4_ = fVar160 * auVar37._4_4_;
          auVar39._8_4_ = fVar160 * auVar37._8_4_;
          auVar39._12_4_ = fVar160 * auVar37._12_4_;
          auVar37 = vroundps_avx(auVar39,1);
          fVar160 = fVar160 + -1.0;
          auVar117._4_4_ = fVar160;
          auVar117._0_4_ = fVar160;
          auVar117._8_4_ = fVar160;
          auVar117._12_4_ = fVar160;
          auVar38 = vminps_avx(auVar37,auVar117);
          auVar37 = ZEXT416(0) << 0x20;
          auVar38 = vmaxps_avx(auVar38,auVar37);
          auVar39 = vsubps_avx(auVar39,auVar38);
          local_d8 = vcvtps2dq_avx(auVar38);
          uVar15 = 0;
          for (uVar20 = uVar20 & 0xff; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
            uVar15 = uVar15 + 1;
          }
          iVar3 = *(int *)(local_d8 + (ulong)uVar15 * 4);
          auVar59._4_4_ = iVar3;
          auVar59._0_4_ = iVar3;
          auVar59._8_4_ = iVar3;
          auVar59._12_4_ = iVar3;
          auVar38 = vpcmpeqd_avx(local_d8,auVar59);
          auVar25 = local_58 & ~auVar38;
          fVar137 = auVar39._0_4_;
          fVar160 = auVar39._4_4_;
          fVar161 = auVar39._8_4_;
          fVar162 = auVar39._12_4_;
          _local_3a8 = local_58;
          if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar25[0xf]) {
            pRVar6 = (this_00->l2w_buf).items;
            pRVar1 = pRVar6 + iVar3;
            RVar4 = pRVar6[iVar3].format;
            if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
              local_d8 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28);
              auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
              auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
              auVar81 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
              auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
              auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
              auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
              auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar41,0x4c);
              local_d8 = vshufps_avx(auVar37,auVar37,0x78);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar60,0x4c);
              auVar37 = vshufps_avx(auVar37,auVar37,0x78);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar81 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar61,0x4c);
              auVar81 = vshufps_avx(auVar81,auVar81,0x78);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
              auVar38 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar62,0x4c);
              auVar38 = vshufps_avx(auVar38,auVar38,0x78);
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar37 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
              auVar81 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar43);
              auVar25 = vshufps_avx(auVar81,auVar43,0xd8);
              auVar170._8_8_ = 0;
              auVar170._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar81 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar170);
              auVar38 = vshufps_avx(auVar81,auVar170,0xd8);
              fVar339 = *(float *)(pcVar7 + lVar22 + 0x24);
              fVar347 = *(float *)(pcVar7 + lVar22 + 0x28);
              fVar348 = *(float *)(pcVar7 + lVar22 + 0x2c);
              fVar350 = *(float *)(pcVar7 + lVar22 + 0x30);
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar347 * fVar347)),ZEXT416((uint)fVar339),
                                        ZEXT416((uint)fVar339));
              auVar81 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar348),ZEXT416((uint)fVar348));
              auVar117 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar350),ZEXT416((uint)fVar350));
              auVar81 = vrsqrtss_avx(auVar117,auVar117);
              fVar204 = auVar81._0_4_;
              fVar204 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar117._0_4_ * -0.5;
              auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar204 * fVar339)),0x30);
              local_d8 = vinsertps_avx(auVar25,ZEXT416((uint)(fVar204 * fVar347)),0x30);
              auVar25 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
              auVar81 = vinsertps_avx(auVar37,ZEXT416((uint)(fVar204 * fVar350)),0x30);
              auVar37 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
              auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)(fVar204 * fVar348)),0x30);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              local_d8 = *(undefined1 (*) [16])(pcVar7 + lVar22);
              auVar37 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
              auVar81 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20);
              auVar38 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30);
            }
            uVar23 = local_d8._0_4_;
            auVar209._4_4_ = uVar23;
            auVar209._0_4_ = uVar23;
            auVar209._8_4_ = uVar23;
            auVar209._12_4_ = uVar23;
            auVar25 = vshufps_avx(local_d8,local_d8,0x55);
            auVar117 = vshufps_avx(local_d8,local_d8,0xaa);
            auVar59 = vshufps_avx(local_d8,local_d8,0xff);
            uVar23 = auVar37._0_4_;
            auVar234._4_4_ = uVar23;
            auVar234._0_4_ = uVar23;
            auVar234._8_4_ = uVar23;
            auVar234._12_4_ = uVar23;
            auVar82 = vshufps_avx(auVar37,auVar37,0x55);
            auVar83 = vshufps_avx(auVar37,auVar37,0xaa);
            auVar37 = vshufps_avx(auVar37,auVar37,0xff);
            uVar23 = auVar81._0_4_;
            auVar248._4_4_ = uVar23;
            auVar248._0_4_ = uVar23;
            auVar248._8_4_ = uVar23;
            auVar248._12_4_ = uVar23;
            auVar84 = vshufps_avx(auVar81,auVar81,0x55);
            auVar85 = vshufps_avx(auVar81,auVar81,0xaa);
            auVar81 = vshufps_avx(auVar81,auVar81,0xff);
            local_368._4_4_ = auVar38._0_4_;
            auVar86 = vshufps_avx(auVar38,auVar38,0x55);
            auVar187 = vshufps_avx(auVar38,auVar38,0xaa);
            auVar38 = vshufps_avx(auVar38,auVar38,0xff);
            RVar4 = pRVar1[1].format;
            local_368._0_4_ = local_368._4_4_;
            fStack_360 = (float)local_368._4_4_;
            fStack_35c = (float)local_368._4_4_;
            if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar7 = pRVar1[1].ptr_ofs;
              lVar22 = uVar19 * pRVar1[1].stride;
              auVar238 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                       ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
              auVar238 = vinsertps_avx(auVar238,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28);
              auVar291 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                       ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
              auVar291 = vinsertps_avx(auVar291,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
              auVar343 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                       ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
              auVar343 = vinsertps_avx(auVar343,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
              auVar87 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
              auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar7 = pRVar1[1].ptr_ofs;
              lVar22 = uVar19 * pRVar1[1].stride;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
              auVar238 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar63,0x4c);
              auVar238 = vshufps_avx(auVar238,auVar238,0x78);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar291 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar64,0x4c);
              auVar291 = vshufps_avx(auVar291,auVar291,0x78);
              auVar65._8_8_ = 0;
              auVar65._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar343 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar65,0x4c);
              auVar343 = vshufps_avx(auVar343,auVar343,0x78);
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
              auVar87 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar66,0x4c);
              auVar87 = vshufps_avx(auVar87,auVar87,0x78);
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar1[1].ptr_ofs;
              lVar22 = uVar19 * pRVar1[1].stride;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar291 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
              auVar123._8_8_ = 0;
              auVar123._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
              auVar238 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar123);
              auVar343 = vshufps_avx(auVar238,auVar123,0xd8);
              auVar210._8_8_ = 0;
              auVar210._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar238 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar210);
              auVar87 = vshufps_avx(auVar238,auVar210,0xd8);
              fVar339 = *(float *)(pcVar7 + lVar22 + 0x24);
              fVar347 = *(float *)(pcVar7 + lVar22 + 0x28);
              fVar348 = *(float *)(pcVar7 + lVar22 + 0x2c);
              fVar350 = *(float *)(pcVar7 + lVar22 + 0x30);
              auVar238 = vfmadd231ss_fma(ZEXT416((uint)(fVar347 * fVar347)),ZEXT416((uint)fVar339),
                                         ZEXT416((uint)fVar339));
              auVar238 = vfmadd231ss_fma(auVar238,ZEXT416((uint)fVar348),ZEXT416((uint)fVar348));
              auVar88 = vfmadd231ss_fma(auVar238,ZEXT416((uint)fVar350),ZEXT416((uint)fVar350));
              auVar238 = vrsqrtss_avx(auVar88,auVar88);
              fVar204 = auVar238._0_4_;
              fVar204 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar88._0_4_ * -0.5;
              auVar87 = vinsertps_avx(auVar87,ZEXT416((uint)(fVar204 * fVar339)),0x30);
              auVar238 = vinsertps_avx(auVar343,ZEXT416((uint)(fVar204 * fVar347)),0x30);
              auVar88 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
              auVar343 = vinsertps_avx(auVar291,ZEXT416((uint)(fVar350 * fVar204)),0x30);
              auVar291 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
              auVar291 = vinsertps_avx(auVar291,ZEXT416((uint)(fVar204 * fVar348)),0x30);
            }
            else {
              auVar238 = auVar187;
              auVar291 = auVar248;
              auVar343 = auVar234;
              auVar87 = auVar209;
              if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = uVar19 * pRVar1[1].stride;
                auVar238 = *(undefined1 (*) [16])(pcVar7 + lVar22);
                auVar291 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
                auVar343 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20);
                auVar87 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30);
              }
            }
            auVar90 = vshufps_avx(auVar238,auVar238,0xff);
            auVar89 = vshufps_avx(auVar87,auVar87,0xff);
            local_388._0_4_ = auVar59._0_4_;
            local_388._4_4_ = auVar59._4_4_;
            fStack_380 = auVar59._8_4_;
            fStack_37c = auVar59._12_4_;
            auVar91 = vshufps_avx(auVar291,auVar291,0xff);
            auVar92 = vshufps_avx(auVar343,auVar343,0xff);
            local_358._0_4_ = auVar81._0_4_;
            local_358._4_4_ = auVar81._4_4_;
            fStack_350 = auVar81._8_4_;
            fStack_34c = auVar81._12_4_;
            auVar249._0_4_ =
                 auVar92._0_4_ * (float)local_358._0_4_ +
                 auVar37._0_4_ * auVar91._0_4_ +
                 auVar90._0_4_ * (float)local_388._0_4_ + auVar38._0_4_ * auVar89._0_4_;
            auVar249._4_4_ =
                 auVar92._4_4_ * (float)local_358._4_4_ +
                 auVar37._4_4_ * auVar91._4_4_ +
                 auVar90._4_4_ * (float)local_388._4_4_ + auVar38._4_4_ * auVar89._4_4_;
            auVar249._8_4_ =
                 auVar92._8_4_ * fStack_350 +
                 auVar37._8_4_ * auVar91._8_4_ +
                 auVar90._8_4_ * fStack_380 + auVar38._8_4_ * auVar89._8_4_;
            auVar249._12_4_ =
                 auVar92._12_4_ * fStack_34c +
                 auVar37._12_4_ * auVar91._12_4_ +
                 auVar90._12_4_ * fStack_37c + auVar38._12_4_ * auVar89._12_4_;
            uVar19 = CONCAT44(auVar249._4_4_,auVar249._0_4_);
            auVar235._0_8_ = uVar19 ^ 0x8000000080000000;
            auVar235._8_4_ = -auVar249._8_4_;
            auVar235._12_4_ = -auVar249._12_4_;
            auVar88 = vcmpps_avx(auVar249,auVar235,1);
            auVar278._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
            auVar278._8_4_ = -auVar89._8_4_;
            auVar278._12_4_ = -auVar89._12_4_;
            auVar89 = vblendvps_avx(auVar89,auVar278,auVar88);
            auVar124._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar124._8_4_ = -auVar90._8_4_;
            auVar124._12_4_ = -auVar90._12_4_;
            auVar90 = vblendvps_avx(auVar90,auVar124,auVar88);
            auVar68._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
            auVar68._8_4_ = -auVar91._8_4_;
            auVar68._12_4_ = -auVar91._12_4_;
            auVar91 = vblendvps_avx(auVar91,auVar68,auVar88);
            auVar69._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar69._8_4_ = -auVar92._8_4_;
            auVar69._12_4_ = -auVar92._12_4_;
            auVar92 = vblendvps_avx(auVar92,auVar69,auVar88);
            auVar96 = vmaxps_avx(auVar235,auVar249);
            auVar70._8_4_ = 0x7fffffff;
            auVar70._0_8_ = 0x7fffffff7fffffff;
            auVar70._12_4_ = 0x7fffffff;
            auVar88 = vandps_avx(auVar249,auVar70);
            fVar339 = auVar88._0_4_;
            fVar347 = auVar88._4_4_;
            fVar348 = auVar88._8_4_;
            fVar350 = auVar88._12_4_;
            auVar44._8_4_ = 0x3f800000;
            auVar44._0_8_ = 0x3f8000003f800000;
            auVar44._12_4_ = 0x3f800000;
            auVar93 = vsubps_avx(auVar44,auVar88);
            auVar93 = vsqrtps_avx(auVar93);
            auVar125._0_4_ =
                 auVar93._0_4_ *
                 (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar125._4_4_ =
                 auVar93._4_4_ *
                 (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar125._8_4_ =
                 auVar93._8_4_ *
                 (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar125._12_4_ =
                 auVar93._12_4_ *
                 (fVar350 * (fVar350 * (fVar350 * (fVar350 * (fVar350 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar171._8_4_ = 0x3fc90fdb;
            auVar171._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar171._12_4_ = 0x3fc90fdb;
            auVar93 = vsubps_avx(auVar171,auVar125);
            auVar97 = ZEXT816(0) << 0x20;
            auVar94 = vmaxps_avx(auVar97,auVar93);
            auVar93 = vcmpps_avx(auVar96,auVar97,1);
            auVar250._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
            auVar250._8_4_ = auVar94._8_4_ ^ 0x80000000;
            auVar250._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar93 = vblendvps_avx(auVar94,auVar250,auVar93);
            auVar88 = vcmpps_avx(auVar88,auVar44,6);
            auVar93 = vsubps_avx(auVar171,auVar93);
            auVar211._8_4_ = 0x7fc00000;
            auVar211._0_8_ = 0x7fc000007fc00000;
            auVar211._12_4_ = 0x7fc00000;
            auVar88 = vblendvps_avx(auVar93,auVar211,auVar88);
            auVar71._0_4_ = fVar137 * auVar88._0_4_;
            auVar71._4_4_ = fVar160 * auVar88._4_4_;
            auVar71._8_4_ = fVar161 * auVar88._8_4_;
            auVar71._12_4_ = fVar162 * auVar88._12_4_;
            auVar126._0_4_ = auVar71._0_4_ * 0.63661975;
            auVar126._4_4_ = auVar71._4_4_ * 0.63661975;
            auVar126._8_4_ = auVar71._8_4_ * 0.63661975;
            auVar126._12_4_ = auVar71._12_4_ * 0.63661975;
            auVar88 = vroundps_avx(auVar126,1);
            auVar172._0_4_ = auVar88._0_4_ * 1.5707964;
            auVar172._4_4_ = auVar88._4_4_ * 1.5707964;
            auVar172._8_4_ = auVar88._8_4_ * 1.5707964;
            auVar172._12_4_ = auVar88._12_4_ * 1.5707964;
            auVar93 = vsubps_avx(auVar71,auVar172);
            fVar339 = auVar93._0_4_;
            fVar204 = fVar339 * fVar339;
            fVar347 = auVar93._4_4_;
            fVar225 = fVar347 * fVar347;
            fVar348 = auVar93._8_4_;
            fVar227 = fVar348 * fVar348;
            fVar350 = auVar93._12_4_;
            fVar229 = fVar350 * fVar350;
            auVar173._0_4_ =
                 fVar339 * ((fVar204 * (fVar204 * (fVar204 * (fVar204 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar204 + 1.0);
            auVar173._4_4_ =
                 fVar347 * ((fVar225 * (fVar225 * (fVar225 * (fVar225 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar225 + 1.0);
            auVar173._8_4_ =
                 fVar348 * ((fVar227 * (fVar227 * (fVar227 * (fVar227 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar227 + 1.0);
            auVar173._12_4_ =
                 fVar350 * ((fVar229 * (fVar229 * (fVar229 * (fVar229 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar229 + 1.0);
            auVar95 = vcvtps2dq_avx(auVar88);
            auVar335._8_4_ = 1;
            auVar335._0_8_ = 0x100000001;
            auVar335._12_4_ = 1;
            auVar88 = vandpd_avx(auVar335,auVar95);
            auVar94 = vpcmpeqd_avx(auVar97,auVar88);
            auVar88 = vpsubd_avx(auVar97,auVar88);
            auVar212._0_4_ =
                 fVar204 * (fVar204 * (fVar204 * (fVar204 * (fVar204 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar212._4_4_ =
                 fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar212._8_4_ =
                 fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar212._12_4_ =
                 fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar93 = vblendvps_avx(auVar173,auVar212,auVar88);
            auVar94 = vblendvps_avx(auVar173,auVar212,auVar94);
            auVar213._8_4_ = 3;
            auVar213._0_8_ = 0x300000003;
            auVar213._12_4_ = 3;
            auVar88 = vandpd_avx(auVar95,auVar213);
            auVar95 = vpcmpeqd_avx(auVar95,auVar95);
            auVar95 = vpaddd_avx(auVar88,auVar95);
            auVar97 = vpminud_avx(auVar95,auVar335);
            auVar95 = vpcmpeqd_avx(auVar97,auVar95);
            auVar266._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
            auVar266._8_4_ = auVar94._8_4_ ^ 0x80000000;
            auVar266._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar94 = vblendvps_avx(auVar94,auVar266,auVar95);
            auVar88 = vpcmpgtd_avx(auVar88,auVar335);
            auVar143._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
            auVar143._8_4_ = auVar93._8_4_ ^ 0x80000000;
            auVar143._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar88 = vblendvps_avx(auVar143,auVar93,auVar88);
            auVar93 = vfmsub213ps_fma(auVar38,auVar96,auVar89);
            auVar95 = vfmsub213ps_fma(auVar59,auVar96,auVar90);
            fVar339 = auVar93._0_4_;
            fVar227 = auVar93._4_4_;
            fVar230 = auVar93._8_4_;
            fVar11 = auVar93._12_4_;
            fVar347 = auVar95._0_4_;
            fVar229 = auVar95._4_4_;
            fVar8 = auVar95._8_4_;
            fVar12 = auVar95._12_4_;
            auVar93 = vfmsub213ps_fma(auVar37,auVar96,auVar91);
            fVar348 = auVar93._0_4_;
            fVar205 = auVar93._4_4_;
            fVar9 = auVar93._8_4_;
            fVar13 = auVar93._12_4_;
            auVar93 = vfmsub213ps_fma(auVar81,auVar96,auVar92);
            fVar350 = auVar93._0_4_;
            fVar226 = auVar93._4_4_;
            fVar10 = auVar93._8_4_;
            fVar14 = auVar93._12_4_;
            auVar72._0_4_ =
                 fVar350 * fVar350 + fVar348 * fVar348 + fVar347 * fVar347 + fVar339 * fVar339;
            auVar72._4_4_ =
                 fVar226 * fVar226 + fVar205 * fVar205 + fVar229 * fVar229 + fVar227 * fVar227;
            auVar72._8_4_ = fVar10 * fVar10 + fVar9 * fVar9 + fVar8 * fVar8 + fVar230 * fVar230;
            auVar72._12_4_ = fVar14 * fVar14 + fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11;
            auVar93 = vrsqrtps_avx(auVar72);
            fVar204 = auVar93._0_4_;
            fVar225 = auVar93._4_4_;
            fVar228 = auVar93._8_4_;
            fVar349 = auVar93._12_4_;
            auVar73._0_4_ = fVar204 * fVar204 * fVar204 * auVar72._0_4_ * -0.5;
            auVar73._4_4_ = fVar225 * fVar225 * fVar225 * auVar72._4_4_ * -0.5;
            auVar73._8_4_ = fVar228 * fVar228 * fVar228 * auVar72._8_4_ * -0.5;
            auVar73._12_4_ = fVar349 * fVar349 * fVar349 * auVar72._12_4_ * -0.5;
            auVar144._8_4_ = 0x3fc00000;
            auVar144._0_8_ = 0x3fc000003fc00000;
            auVar144._12_4_ = 0x3fc00000;
            auVar93 = vfmadd231ps_fma(auVar73,auVar144,auVar93);
            fVar204 = auVar93._0_4_;
            fVar228 = auVar93._4_4_;
            fVar349 = auVar93._8_4_;
            fVar318 = auVar93._12_4_;
            fVar225 = auVar88._0_4_;
            auVar127._0_4_ = fVar339 * fVar204 * fVar225;
            fVar339 = auVar88._4_4_;
            auVar127._4_4_ = fVar227 * fVar228 * fVar339;
            fVar227 = auVar88._8_4_;
            auVar127._8_4_ = fVar230 * fVar349 * fVar227;
            fVar230 = auVar88._12_4_;
            auVar127._12_4_ = fVar11 * fVar318 * fVar230;
            auVar214._0_4_ = fVar347 * fVar204 * fVar225;
            auVar214._4_4_ = fVar229 * fVar228 * fVar339;
            auVar214._8_4_ = fVar8 * fVar349 * fVar227;
            auVar214._12_4_ = fVar12 * fVar318 * fVar230;
            auVar336._0_4_ = fVar348 * fVar204 * fVar225;
            auVar336._4_4_ = fVar205 * fVar228 * fVar339;
            auVar336._8_4_ = fVar9 * fVar349 * fVar227;
            auVar336._12_4_ = fVar13 * fVar318 * fVar230;
            auVar251._0_4_ = fVar350 * fVar204 * fVar225;
            auVar251._4_4_ = fVar226 * fVar228 * fVar339;
            auVar251._8_4_ = fVar10 * fVar349 * fVar227;
            auVar251._12_4_ = fVar14 * fVar318 * fVar230;
            auVar93 = vfmadd231ps_fma(auVar127,auVar94,auVar38);
            auVar95 = vfmadd231ps_fma(auVar214,auVar94,auVar59);
            auVar97 = vfmadd231ps_fma(auVar336,auVar94,auVar37);
            auVar94 = vfmadd231ps_fma(auVar251,auVar81,auVar94);
            auVar88 = vsubps_avx(auVar89,auVar38);
            auVar88 = vfmadd213ps_fma(auVar88,auVar39,auVar38);
            auVar38 = vsubps_avx(auVar90,auVar59);
            auVar59 = vfmadd213ps_fma(auVar38,auVar39,auVar59);
            auVar38 = vsubps_avx(auVar91,auVar37);
            auVar38 = vfmadd213ps_fma(auVar38,auVar39,auVar37);
            auVar37 = vsubps_avx(auVar92,auVar81);
            auVar37 = vfmadd213ps_fma(auVar37,auVar39,auVar81);
            fVar339 = auVar88._0_4_;
            fVar225 = auVar88._4_4_;
            fVar228 = auVar88._8_4_;
            fVar349 = auVar88._12_4_;
            fVar347 = auVar59._0_4_;
            fVar227 = auVar59._4_4_;
            fVar230 = auVar59._8_4_;
            fVar11 = auVar59._12_4_;
            fVar348 = auVar38._0_4_;
            fVar229 = auVar38._4_4_;
            fVar8 = auVar38._8_4_;
            fVar12 = auVar38._12_4_;
            fVar350 = auVar37._0_4_;
            fVar205 = auVar37._4_4_;
            fVar9 = auVar37._8_4_;
            fVar13 = auVar37._12_4_;
            auVar45._0_4_ =
                 fVar350 * fVar350 + fVar348 * fVar348 + fVar347 * fVar347 + fVar339 * fVar339;
            auVar45._4_4_ =
                 fVar205 * fVar205 + fVar229 * fVar229 + fVar227 * fVar227 + fVar225 * fVar225;
            auVar45._8_4_ = fVar9 * fVar9 + fVar8 * fVar8 + fVar230 * fVar230 + fVar228 * fVar228;
            auVar45._12_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11 + fVar349 * fVar349
            ;
            auVar37 = vrsqrtps_avx(auVar45);
            fVar204 = auVar37._0_4_;
            fVar226 = auVar37._4_4_;
            fVar10 = auVar37._8_4_;
            fVar14 = auVar37._12_4_;
            auVar287._0_4_ = fVar204 * fVar204 * auVar45._0_4_ * -0.5 * fVar204;
            auVar287._4_4_ = fVar226 * fVar226 * auVar45._4_4_ * -0.5 * fVar226;
            auVar287._8_4_ = fVar10 * fVar10 * auVar45._8_4_ * -0.5 * fVar10;
            auVar287._12_4_ = fVar14 * fVar14 * auVar45._12_4_ * -0.5 * fVar14;
            auVar37 = vfmadd231ps_fma(auVar287,auVar37,auVar144);
            fVar204 = auVar37._0_4_;
            auVar46._0_4_ = fVar204 * fVar339;
            fVar339 = auVar37._4_4_;
            auVar46._4_4_ = fVar339 * fVar225;
            fVar225 = auVar37._8_4_;
            auVar46._8_4_ = fVar225 * fVar228;
            fVar226 = auVar37._12_4_;
            auVar46._12_4_ = fVar226 * fVar349;
            auVar74._0_4_ = fVar204 * fVar347;
            auVar74._4_4_ = fVar339 * fVar227;
            auVar74._8_4_ = fVar225 * fVar230;
            auVar74._12_4_ = fVar226 * fVar11;
            auVar174._0_4_ = fVar348 * fVar204;
            auVar174._4_4_ = fVar229 * fVar339;
            auVar174._8_4_ = fVar8 * fVar225;
            auVar174._12_4_ = fVar12 * fVar226;
            auVar267._0_4_ = fVar350 * fVar204;
            auVar267._4_4_ = fVar205 * fVar339;
            auVar267._8_4_ = fVar9 * fVar225;
            auVar267._12_4_ = fVar13 * fVar226;
            auVar145._8_4_ = 0x3f7fdf3b;
            auVar145._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar145._12_4_ = 0x3f7fdf3b;
            auVar59 = vcmpps_avx(auVar96,auVar145,6);
            auVar37 = vblendvps_avx(auVar93,auVar46,auVar59);
            auVar81 = vblendvps_avx(auVar95,auVar74,auVar59);
            auVar38 = vblendvps_avx(auVar97,auVar174,auVar59);
            auVar59 = vblendvps_avx(auVar94,auVar267,auVar59);
            auVar128._8_4_ = 0x3f800000;
            auVar128._0_8_ = 0x3f8000003f800000;
            auVar128._12_4_ = 0x3f800000;
            auVar88 = vsubps_avx(auVar128,auVar39);
            fVar339 = auVar238._0_4_;
            auVar175._0_4_ = fVar137 * fVar339;
            auVar175._4_4_ = fVar160 * fVar339;
            auVar175._8_4_ = fVar161 * fVar339;
            auVar175._12_4_ = fVar162 * fVar339;
            auVar89 = vfmadd213ps_fma(auVar209,auVar88,auVar175);
            auVar39 = vshufps_avx(auVar238,auVar238,0x55);
            auVar176._0_4_ = fVar137 * auVar39._0_4_;
            auVar176._4_4_ = fVar160 * auVar39._4_4_;
            auVar176._8_4_ = fVar161 * auVar39._8_4_;
            auVar176._12_4_ = fVar162 * auVar39._12_4_;
            auVar90 = vfmadd213ps_fma(auVar25,auVar88,auVar176);
            auVar39 = vshufps_avx(auVar238,auVar238,0xaa);
            auVar177._0_4_ = fVar137 * auVar39._0_4_;
            auVar177._4_4_ = fVar160 * auVar39._4_4_;
            auVar177._8_4_ = fVar161 * auVar39._8_4_;
            auVar177._12_4_ = fVar162 * auVar39._12_4_;
            auVar238 = vfmadd213ps_fma(auVar117,auVar88,auVar177);
            fVar339 = auVar291._0_4_;
            auVar178._0_4_ = fVar137 * fVar339;
            auVar178._4_4_ = fVar160 * fVar339;
            auVar178._8_4_ = fVar161 * fVar339;
            auVar178._12_4_ = fVar162 * fVar339;
            auVar91 = vfmadd213ps_fma(auVar234,auVar88,auVar178);
            auVar39 = vshufps_avx(auVar291,auVar291,0x55);
            auVar179._0_4_ = fVar137 * auVar39._0_4_;
            auVar179._4_4_ = fVar160 * auVar39._4_4_;
            auVar179._8_4_ = fVar161 * auVar39._8_4_;
            auVar179._12_4_ = fVar162 * auVar39._12_4_;
            auVar82 = vfmadd213ps_fma(auVar82,auVar88,auVar179);
            auVar39 = vshufps_avx(auVar291,auVar291,0xaa);
            auVar180._0_4_ = fVar137 * auVar39._0_4_;
            auVar180._4_4_ = fVar160 * auVar39._4_4_;
            auVar180._8_4_ = fVar161 * auVar39._8_4_;
            auVar180._12_4_ = fVar162 * auVar39._12_4_;
            auVar83 = vfmadd213ps_fma(auVar83,auVar88,auVar180);
            fVar339 = auVar343._0_4_;
            auVar181._0_4_ = fVar137 * fVar339;
            auVar181._4_4_ = fVar160 * fVar339;
            auVar181._8_4_ = fVar161 * fVar339;
            auVar181._12_4_ = fVar162 * fVar339;
            auVar291 = vfmadd213ps_fma(auVar248,auVar88,auVar181);
            auVar39 = vshufps_avx(auVar343,auVar343,0x55);
            auVar182._0_4_ = fVar137 * auVar39._0_4_;
            auVar182._4_4_ = fVar160 * auVar39._4_4_;
            auVar182._8_4_ = fVar161 * auVar39._8_4_;
            auVar182._12_4_ = fVar162 * auVar39._12_4_;
            auVar84 = vfmadd213ps_fma(auVar84,auVar88,auVar182);
            auVar39 = vshufps_avx(auVar343,auVar343,0xaa);
            auVar183._0_4_ = fVar137 * auVar39._0_4_;
            auVar183._4_4_ = fVar160 * auVar39._4_4_;
            auVar183._8_4_ = fVar161 * auVar39._8_4_;
            auVar183._12_4_ = fVar162 * auVar39._12_4_;
            auVar85 = vfmadd213ps_fma(auVar85,auVar88,auVar183);
            fVar339 = auVar87._0_4_;
            auVar39 = vshufps_avx(auVar87,auVar87,0x55);
            auVar25 = vshufps_avx(auVar87,auVar87,0xaa);
            auVar184._0_4_ = fVar137 * fVar339;
            auVar184._4_4_ = fVar160 * fVar339;
            auVar184._8_4_ = fVar161 * fVar339;
            auVar184._12_4_ = fVar162 * fVar339;
            auVar215._0_4_ = fVar137 * auVar39._0_4_;
            auVar215._4_4_ = fVar160 * auVar39._4_4_;
            auVar215._8_4_ = fVar161 * auVar39._8_4_;
            auVar215._12_4_ = fVar162 * auVar39._12_4_;
            auVar252._0_4_ = fVar137 * auVar25._0_4_;
            auVar252._4_4_ = fVar160 * auVar25._4_4_;
            auVar252._8_4_ = fVar161 * auVar25._8_4_;
            auVar252._12_4_ = fVar162 * auVar25._12_4_;
            auVar343 = vfmadd213ps_fma(_local_368,auVar88,auVar184);
            auVar86 = vfmadd213ps_fma(auVar86,auVar88,auVar215);
            auVar187 = vfmadd213ps_fma(auVar187,auVar88,auVar252);
            fVar137 = auVar38._0_4_;
            fVar205 = auVar81._0_4_;
            auVar129._0_4_ = fVar205 * fVar137;
            fVar161 = auVar38._4_4_;
            fVar226 = auVar81._4_4_;
            auVar129._4_4_ = fVar226 * fVar161;
            fVar339 = auVar38._8_4_;
            fVar228 = auVar81._8_4_;
            auVar129._8_4_ = fVar228 * fVar339;
            fVar348 = auVar38._12_4_;
            fVar230 = auVar81._12_4_;
            auVar129._12_4_ = fVar230 * fVar348;
            fVar160 = auVar59._0_4_;
            fVar204 = auVar37._0_4_;
            auVar216._0_4_ = fVar204 * fVar160;
            fVar162 = auVar59._4_4_;
            fVar225 = auVar37._4_4_;
            auVar216._4_4_ = fVar225 * fVar162;
            fVar347 = auVar59._8_4_;
            fVar227 = auVar37._8_4_;
            auVar216._8_4_ = fVar227 * fVar347;
            fVar350 = auVar59._12_4_;
            fVar229 = auVar37._12_4_;
            auVar216._12_4_ = fVar229 * fVar350;
            auVar37 = vsubps_avx(auVar129,auVar216);
            auVar217._0_4_ = fVar204 * fVar204;
            auVar217._4_4_ = fVar225 * fVar225;
            auVar217._8_4_ = fVar227 * fVar227;
            auVar217._12_4_ = fVar229 * fVar229;
            auVar253._0_4_ = fVar205 * fVar205;
            auVar253._4_4_ = fVar226 * fVar226;
            auVar253._8_4_ = fVar228 * fVar228;
            auVar253._12_4_ = fVar230 * fVar230;
            auVar268._0_4_ = auVar217._0_4_ + auVar253._0_4_;
            auVar268._4_4_ = auVar217._4_4_ + auVar253._4_4_;
            auVar268._8_4_ = auVar217._8_4_ + auVar253._8_4_;
            auVar268._12_4_ = auVar217._12_4_ + auVar253._12_4_;
            auVar81 = vsubps_avx(auVar217,auVar253);
            auVar254._0_4_ = fVar205 * fVar160;
            auVar254._4_4_ = fVar226 * fVar162;
            auVar254._8_4_ = fVar228 * fVar347;
            auVar254._12_4_ = fVar230 * fVar350;
            auVar236._0_4_ = fVar205 * fVar204;
            auVar236._4_4_ = fVar226 * fVar225;
            auVar236._8_4_ = fVar228 * fVar227;
            auVar236._12_4_ = fVar230 * fVar229;
            auVar146._0_4_ = fVar204 * fVar137;
            auVar146._4_4_ = fVar225 * fVar161;
            auVar146._8_4_ = fVar227 * fVar339;
            auVar146._12_4_ = fVar229 * fVar348;
            auVar38 = vsubps_avx(auVar254,auVar146);
            auVar255._0_4_ = fVar137 * fVar160;
            auVar255._4_4_ = fVar161 * fVar162;
            auVar255._8_4_ = fVar339 * fVar347;
            auVar255._12_4_ = fVar348 * fVar350;
            auVar39 = vsubps_avx(auVar255,auVar236);
            auVar75._0_4_ = fVar137 * fVar137;
            auVar75._4_4_ = fVar161 * fVar161;
            auVar75._8_4_ = fVar339 * fVar339;
            auVar75._12_4_ = fVar348 * fVar348;
            auVar25 = vsubps_avx(auVar268,auVar75);
            auVar269._0_4_ = auVar75._0_4_ + auVar81._0_4_;
            auVar269._4_4_ = auVar75._4_4_ + auVar81._4_4_;
            auVar269._8_4_ = auVar75._8_4_ + auVar81._8_4_;
            auVar269._12_4_ = auVar75._12_4_ + auVar81._12_4_;
            auVar81 = vsubps_avx(auVar81,auVar75);
            auVar47._0_4_ = fVar160 * fVar160;
            auVar47._4_4_ = fVar162 * fVar162;
            auVar47._8_4_ = fVar347 * fVar347;
            auVar47._12_4_ = fVar350 * fVar350;
            auVar25 = vsubps_avx(auVar25,auVar47);
            auVar117 = vsubps_avx(auVar269,auVar47);
            auVar48._0_4_ = auVar47._0_4_ + auVar81._0_4_;
            auVar48._4_4_ = auVar47._4_4_ + auVar81._4_4_;
            auVar48._8_4_ = auVar47._8_4_ + auVar81._8_4_;
            auVar48._12_4_ = auVar47._12_4_ + auVar81._12_4_;
            auVar311._0_4_ = auVar129._0_4_ + auVar216._0_4_ + auVar129._0_4_ + auVar216._0_4_;
            auVar311._4_4_ = auVar129._4_4_ + auVar216._4_4_ + auVar129._4_4_ + auVar216._4_4_;
            auVar311._8_4_ = auVar129._8_4_ + auVar216._8_4_ + auVar129._8_4_ + auVar216._8_4_;
            auVar311._12_4_ = auVar129._12_4_ + auVar216._12_4_ + auVar129._12_4_ + auVar216._12_4_;
            auVar76._0_4_ = auVar38._0_4_ + auVar38._0_4_;
            auVar76._4_4_ = auVar38._4_4_ + auVar38._4_4_;
            auVar76._8_4_ = auVar38._8_4_ + auVar38._8_4_;
            auVar76._12_4_ = auVar38._12_4_ + auVar38._12_4_;
            auVar92 = ZEXT816(0) << 0x40;
            auVar256._0_4_ = auVar76._0_4_ * 0.0;
            auVar256._4_4_ = auVar76._4_4_ * 0.0;
            auVar256._8_4_ = auVar76._8_4_ * 0.0;
            auVar256._12_4_ = auVar76._12_4_ * 0.0;
            auVar81 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar311,auVar256);
            auVar185._0_4_ = auVar311._0_4_ + auVar256._0_4_;
            auVar185._4_4_ = auVar311._4_4_ + auVar256._4_4_;
            auVar185._8_4_ = auVar311._8_4_ + auVar256._8_4_;
            auVar185._12_4_ = auVar311._12_4_ + auVar256._12_4_;
            auVar38 = vfmadd213ps_fma(auVar311,auVar92,auVar76);
            auVar77._0_4_ = auVar255._0_4_ + auVar236._0_4_ + auVar255._0_4_ + auVar236._0_4_;
            auVar77._4_4_ = auVar255._4_4_ + auVar236._4_4_ + auVar255._4_4_ + auVar236._4_4_;
            auVar77._8_4_ = auVar255._8_4_ + auVar236._8_4_ + auVar255._8_4_ + auVar236._8_4_;
            auVar77._12_4_ = auVar255._12_4_ + auVar236._12_4_ + auVar255._12_4_ + auVar236._12_4_;
            auVar257._0_4_ = auVar77._0_4_ * 0.0;
            auVar257._4_4_ = auVar77._4_4_ * 0.0;
            auVar257._8_4_ = auVar77._8_4_ * 0.0;
            auVar257._12_4_ = auVar77._12_4_ * 0.0;
            auVar59 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar117,auVar257);
            auVar279._0_4_ = auVar117._0_4_ + auVar257._0_4_;
            auVar279._4_4_ = auVar117._4_4_ + auVar257._4_4_;
            auVar279._8_4_ = auVar117._8_4_ + auVar257._8_4_;
            auVar279._12_4_ = auVar117._12_4_ + auVar257._12_4_;
            auVar117 = vfmadd213ps_fma(auVar117,auVar92,auVar77);
            auVar78._0_4_ = auVar37._0_4_ + auVar37._0_4_;
            auVar78._4_4_ = auVar37._4_4_ + auVar37._4_4_;
            auVar78._8_4_ = auVar37._8_4_ + auVar37._8_4_;
            auVar78._12_4_ = auVar37._12_4_ + auVar37._12_4_;
            auVar270._0_4_ = auVar59._0_4_ + auVar78._0_4_;
            auVar270._4_4_ = auVar59._4_4_ + auVar78._4_4_;
            auVar270._8_4_ = auVar59._8_4_ + auVar78._8_4_;
            auVar270._12_4_ = auVar59._12_4_ + auVar78._12_4_;
            auVar59 = vfmadd231ps_fma(auVar279,auVar78,auVar92);
            auVar87 = vfmadd231ps_fma(auVar117,auVar92,auVar78);
            auVar130._0_4_ = auVar39._0_4_ + auVar39._0_4_;
            auVar130._4_4_ = auVar39._4_4_ + auVar39._4_4_;
            auVar130._8_4_ = auVar39._8_4_ + auVar39._8_4_;
            auVar130._12_4_ = auVar39._12_4_ + auVar39._12_4_;
            auVar79._0_4_ = auVar48._0_4_ * 0.0;
            auVar79._4_4_ = auVar48._4_4_ * 0.0;
            auVar79._8_4_ = auVar48._8_4_ * 0.0;
            auVar79._12_4_ = auVar48._12_4_ * 0.0;
            auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar130,auVar79);
            auVar321._0_4_ = auVar130._0_4_ + auVar79._0_4_;
            auVar321._4_4_ = auVar130._4_4_ + auVar79._4_4_;
            auVar321._8_4_ = auVar130._8_4_ + auVar79._8_4_;
            auVar321._12_4_ = auVar130._12_4_ + auVar79._12_4_;
            auVar39 = vfmadd213ps_fma(auVar130,auVar92,auVar48);
            auVar49._0_4_ = auVar254._0_4_ + auVar146._0_4_ + auVar254._0_4_ + auVar146._0_4_;
            auVar49._4_4_ = auVar254._4_4_ + auVar146._4_4_ + auVar254._4_4_ + auVar146._4_4_;
            auVar49._8_4_ = auVar254._8_4_ + auVar146._8_4_ + auVar254._8_4_ + auVar146._8_4_;
            auVar49._12_4_ = auVar254._12_4_ + auVar146._12_4_ + auVar254._12_4_ + auVar146._12_4_;
            fVar204 = auVar49._0_4_ + auVar37._0_4_;
            fVar225 = auVar49._4_4_ + auVar37._4_4_;
            fVar227 = auVar49._8_4_ + auVar37._8_4_;
            fVar229 = auVar49._12_4_ + auVar37._12_4_;
            auVar117 = vfmadd231ps_fma(auVar321,auVar49,auVar92);
            auVar39 = vfmadd231ps_fma(auVar39,auVar92,auVar49);
            auVar88 = vfmadd231ps_fma(auVar185,auVar25,auVar92);
            auVar92 = vfmadd231ps_fma(auVar38,auVar92,auVar25);
            local_2c8._0_4_ = auVar238._0_4_;
            local_2c8._4_4_ = auVar238._4_4_;
            fStack_2c0 = auVar238._8_4_;
            fStack_2bc = auVar238._12_4_;
            auVar302._0_4_ = fVar204 * 0.0;
            auVar302._4_4_ = fVar225 * 0.0;
            auVar302._8_4_ = fVar227 * 0.0;
            auVar302._12_4_ = fVar229 * 0.0;
            auVar37 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar270,auVar302);
            fVar339 = auVar117._0_4_;
            auVar271._0_4_ = fVar339 * 0.0;
            fVar347 = auVar117._4_4_;
            auVar271._4_4_ = fVar347 * 0.0;
            fVar348 = auVar117._8_4_;
            auVar271._8_4_ = fVar348 * 0.0;
            fVar350 = auVar117._12_4_;
            auVar271._12_4_ = fVar350 * 0.0;
            auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar59,auVar271);
            fVar137 = auVar39._0_4_;
            auVar50._0_4_ = fVar137 * 0.0;
            fVar160 = auVar39._4_4_;
            auVar50._4_4_ = fVar160 * 0.0;
            fVar161 = auVar39._8_4_;
            auVar50._8_4_ = fVar161 * 0.0;
            fVar162 = auVar39._12_4_;
            auVar50._12_4_ = fVar162 * 0.0;
            auVar39 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar87,auVar50);
            auVar238 = vfmadd231ps_fma(auVar302,auVar82,auVar270);
            auVar93 = vfmadd231ps_fma(auVar271,auVar82,auVar59);
            auVar117 = vfmadd213ps_fma(auVar82,auVar87,auVar50);
            local_348._0_4_ = auVar85._0_4_;
            local_348._4_4_ = auVar85._4_4_;
            uStack_340._0_4_ = auVar85._8_4_;
            uStack_340._4_4_ = auVar85._12_4_;
            auVar186._0_4_ = fVar204 * (float)local_348._0_4_;
            auVar186._4_4_ = fVar225 * (float)local_348._4_4_;
            auVar186._8_4_ = fVar227 * (float)uStack_340;
            auVar186._12_4_ = fVar229 * uStack_340._4_4_;
            auVar147._0_4_ = fVar339 * (float)local_348._0_4_;
            auVar147._4_4_ = fVar347 * (float)local_348._4_4_;
            auVar147._8_4_ = fVar348 * (float)uStack_340;
            auVar147._12_4_ = fVar350 * uStack_340._4_4_;
            auVar80._0_4_ = (float)local_348._0_4_ * fVar137;
            auVar80._4_4_ = (float)local_348._4_4_ * fVar160;
            auVar80._8_4_ = (float)uStack_340 * fVar161;
            auVar80._12_4_ = uStack_340._4_4_ * fVar162;
            auVar82 = vfmadd231ps_fma(auVar186,auVar84,auVar270);
            auVar85 = vfmadd231ps_fma(auVar147,auVar84,auVar59);
            auVar84 = vfmadd231ps_fma(auVar80,auVar87,auVar84);
            local_328._0_4_ = auVar187._0_4_;
            local_328._4_4_ = auVar187._4_4_;
            uStack_320._0_4_ = auVar187._8_4_;
            uStack_320._4_4_ = auVar187._12_4_;
            auVar342._0_4_ = fVar204 * (float)local_328._0_4_;
            auVar342._4_4_ = fVar225 * (float)local_328._4_4_;
            auVar342._8_4_ = fVar227 * (float)uStack_320;
            auVar342._12_4_ = fVar229 * uStack_320._4_4_;
            auVar288._0_4_ = fVar339 * (float)local_328._0_4_;
            auVar288._4_4_ = fVar347 * (float)local_328._4_4_;
            auVar288._8_4_ = fVar348 * (float)uStack_320;
            auVar288._12_4_ = fVar350 * uStack_320._4_4_;
            auVar131._0_4_ = (float)local_328._0_4_ * fVar137;
            auVar131._4_4_ = (float)local_328._4_4_ * fVar160;
            auVar131._8_4_ = (float)uStack_320 * fVar161;
            auVar131._12_4_ = uStack_320._4_4_ * fVar162;
            auVar187 = vfmadd231ps_fma(auVar342,auVar86,auVar270);
            auVar59 = vfmadd231ps_fma(auVar288,auVar86,auVar59);
            auVar86 = vfmadd231ps_fma(auVar131,auVar86,auVar87);
            local_2e8._0_4_ = auVar25._0_4_;
            local_2e8._4_4_ = auVar25._4_4_;
            fStack_2e0 = auVar25._8_4_;
            fStack_2dc = auVar25._12_4_;
            local_388._0_4_ = auVar81._0_4_;
            local_388._4_4_ = auVar81._4_4_;
            fStack_380 = auVar81._8_4_;
            fStack_37c = auVar81._12_4_;
            auVar218._0_4_ = (float)local_2e8._0_4_ + (float)local_388._0_4_;
            auVar218._4_4_ = (float)local_2e8._4_4_ + (float)local_388._4_4_;
            auVar218._8_4_ = fStack_2e0 + fStack_380;
            auVar218._12_4_ = fStack_2dc + fStack_37c;
            auVar37 = vfmadd231ps_fma(auVar37,auVar89,auVar218);
            auVar81 = vfmadd231ps_fma(auVar38,auVar89,auVar88);
            auVar38 = vfmadd231ps_fma(auVar39,auVar92,auVar89);
            auVar39 = vfmadd231ps_fma(auVar238,auVar91,auVar218);
            auVar25 = vfmadd231ps_fma(auVar93,auVar91,auVar88);
            auVar117 = vfmadd231ps_fma(auVar117,auVar92,auVar91);
            auVar82 = vfmadd231ps_fma(auVar82,auVar291,auVar218);
            auVar85 = vfmadd231ps_fma(auVar85,auVar291,auVar88);
            auVar84 = vfmadd231ps_fma(auVar84,auVar92,auVar291);
            auVar187 = vfmadd231ps_fma(auVar187,auVar343,auVar218);
            local_3a8._4_4_ = auVar187._4_4_ + auVar90._4_4_ + 0.0;
            local_3a8._0_4_ = auVar187._0_4_ + auVar90._0_4_ + 0.0;
            fStack_3a0 = auVar187._8_4_ + auVar90._8_4_ + 0.0;
            fStack_39c = auVar187._12_4_ + auVar90._12_4_ + 0.0;
            auVar59 = vfmadd231ps_fma(auVar59,auVar343,auVar88);
            local_398._4_4_ = auVar59._4_4_ + (float)local_2c8._4_4_ + 0.0;
            local_398._0_4_ = auVar59._0_4_ + (float)local_2c8._0_4_ + 0.0;
            fStack_390 = auVar59._8_4_ + fStack_2c0 + 0.0;
            fStack_38c = auVar59._12_4_ + fStack_2bc + 0.0;
            auVar59 = vfmadd231ps_fma(auVar86,auVar343,auVar92);
            fVar339 = auVar59._0_4_ + auVar83._0_4_ + 0.0;
            fVar347 = auVar59._4_4_ + auVar83._4_4_ + 0.0;
            fVar348 = auVar59._8_4_ + auVar83._8_4_ + 0.0;
            fVar350 = auVar59._12_4_ + auVar83._12_4_ + 0.0;
            auVar132._0_4_ = auVar85._0_4_ * auVar117._0_4_;
            auVar132._4_4_ = auVar85._4_4_ * auVar117._4_4_;
            auVar132._8_4_ = auVar85._8_4_ * auVar117._8_4_;
            auVar132._12_4_ = auVar85._12_4_ * auVar117._12_4_;
            auVar59 = vfmsub231ps_fma(auVar132,auVar25,auVar84);
            auVar312._0_4_ = auVar39._0_4_ * auVar84._0_4_;
            auVar312._4_4_ = auVar39._4_4_ * auVar84._4_4_;
            auVar312._8_4_ = auVar39._8_4_ * auVar84._8_4_;
            auVar312._12_4_ = auVar39._12_4_ * auVar84._12_4_;
            auVar83 = vfmsub231ps_fma(auVar312,auVar117,auVar82);
            auVar289._0_4_ = auVar25._0_4_ * auVar82._0_4_;
            auVar289._4_4_ = auVar25._4_4_ * auVar82._4_4_;
            auVar289._8_4_ = auVar25._8_4_ * auVar82._8_4_;
            auVar289._12_4_ = auVar25._12_4_ * auVar82._12_4_;
            auVar86 = vfmsub231ps_fma(auVar289,auVar39,auVar85);
            fVar137 = auVar38._0_4_;
            auVar51._0_4_ = fVar137 * auVar82._0_4_;
            fVar160 = auVar38._4_4_;
            auVar51._4_4_ = fVar160 * auVar82._4_4_;
            fVar161 = auVar38._8_4_;
            auVar51._8_4_ = fVar161 * auVar82._8_4_;
            fVar162 = auVar38._12_4_;
            auVar51._12_4_ = fVar162 * auVar82._12_4_;
            auVar187 = vfmsub231ps_fma(auVar51,auVar37,auVar84);
            auVar219._0_4_ = auVar81._0_4_ * auVar84._0_4_;
            auVar219._4_4_ = auVar81._4_4_ * auVar84._4_4_;
            auVar219._8_4_ = auVar81._8_4_ * auVar84._8_4_;
            auVar219._12_4_ = auVar81._12_4_ * auVar84._12_4_;
            auVar84 = vfmsub231ps_fma(auVar219,auVar85,auVar38);
            auVar280._0_4_ = auVar37._0_4_ * auVar85._0_4_;
            auVar280._4_4_ = auVar37._4_4_ * auVar85._4_4_;
            auVar280._8_4_ = auVar37._8_4_ * auVar85._8_4_;
            auVar280._12_4_ = auVar37._12_4_ * auVar85._12_4_;
            auVar85 = vfmsub231ps_fma(auVar280,auVar81,auVar82);
            auVar148._0_4_ = auVar25._0_4_ * fVar137;
            auVar148._4_4_ = auVar25._4_4_ * fVar160;
            auVar148._8_4_ = auVar25._8_4_ * fVar161;
            auVar148._12_4_ = auVar25._12_4_ * fVar162;
            auVar82 = vfmsub231ps_fma(auVar148,auVar81,auVar117);
            auVar237._0_4_ = auVar37._0_4_ * auVar117._0_4_;
            auVar237._4_4_ = auVar37._4_4_ * auVar117._4_4_;
            auVar237._8_4_ = auVar37._8_4_ * auVar117._8_4_;
            auVar237._12_4_ = auVar37._12_4_ * auVar117._12_4_;
            auVar38 = vfmsub231ps_fma(auVar237,auVar38,auVar39);
            auVar303._0_4_ = auVar39._0_4_ * auVar81._0_4_;
            auVar303._4_4_ = auVar39._4_4_ * auVar81._4_4_;
            auVar303._8_4_ = auVar39._8_4_ * auVar81._8_4_;
            auVar303._12_4_ = auVar39._12_4_ * auVar81._12_4_;
            auVar238 = vfmsub231ps_fma(auVar303,auVar37,auVar25);
            auVar322._0_4_ = auVar86._0_4_ * fVar137;
            auVar322._4_4_ = auVar86._4_4_ * fVar160;
            auVar322._8_4_ = auVar86._8_4_ * fVar161;
            auVar322._12_4_ = auVar86._12_4_ * fVar162;
            auVar81 = vfmadd231ps_fma(auVar322,auVar83,auVar81);
            auVar39 = vfmadd231ps_fma(auVar81,auVar59,auVar37);
            auVar37 = vdivps_avx(auVar59,auVar39);
            auVar117 = vdivps_avx(auVar84,auVar39);
            auVar82 = vdivps_avx(auVar82,auVar39);
            auVar81 = vdivps_avx(auVar83,auVar39);
            auVar25 = vdivps_avx(auVar187,auVar39);
            auVar59 = vdivps_avx(auVar38,auVar39);
            local_378 = vdivps_avx(auVar86,auVar39);
            auVar38 = vdivps_avx(auVar85,auVar39);
            auVar39 = vdivps_avx(auVar238,auVar39);
            auVar281._0_4_ = fVar339 * local_378._0_4_;
            auVar281._4_4_ = fVar347 * local_378._4_4_;
            auVar281._8_4_ = fVar348 * local_378._8_4_;
            auVar281._12_4_ = fVar350 * local_378._12_4_;
            auVar290._0_4_ = fVar339 * auVar38._0_4_;
            auVar290._4_4_ = fVar347 * auVar38._4_4_;
            auVar290._8_4_ = fVar348 * auVar38._8_4_;
            auVar290._12_4_ = fVar350 * auVar38._12_4_;
            auVar313._0_4_ = fVar339 * auVar39._0_4_;
            auVar313._4_4_ = fVar347 * auVar39._4_4_;
            auVar313._8_4_ = fVar348 * auVar39._8_4_;
            auVar313._12_4_ = fVar350 * auVar39._12_4_;
          }
          else {
            while (uVar20 = vmovmskps_avx(_local_3a8), uVar20 != 0) {
              uVar15 = 0;
              for (uVar20 = uVar20 & 0xff; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar15 = uVar15 + 1;
              }
              iVar3 = *(int *)(local_d8 + (ulong)uVar15 * 4);
              auVar81._4_4_ = iVar3;
              auVar81._0_4_ = iVar3;
              auVar81._8_4_ = iVar3;
              auVar81._12_4_ = iVar3;
              auVar37 = vpcmpeqd_avx(auVar81,local_d8);
              pRVar6 = (this_00->l2w_buf).items;
              pRVar1 = pRVar6 + iVar3;
              RVar4 = pRVar6[iVar3].format;
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar1->ptr_ofs;
                lVar22 = pRVar1->stride * uVar19;
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
                local_108 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28);
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
                local_118 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
                local_128 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
                auVar81 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
                local_138 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar1->ptr_ofs;
                lVar22 = pRVar1->stride * uVar19;
                auVar82._8_8_ = 0;
                auVar82._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar82,0x4c);
                local_108 = vshufps_avx(auVar81,auVar81,0x78);
                auVar83._8_8_ = 0;
                auVar83._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar83,0x4c);
                local_118 = vshufps_avx(auVar81,auVar81,0x78);
                auVar84._8_8_ = 0;
                auVar84._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar84,0x4c);
                local_128 = vshufps_avx(auVar81,auVar81,0x78);
                auVar85._8_8_ = 0;
                auVar85._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
                auVar81 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar85,0x4c);
                local_138 = vshufps_avx(auVar81,auVar81,0x78);
              }
              else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar7 = pRVar1->ptr_ofs;
                lVar22 = pRVar1->stride * uVar19;
                auVar86._8_8_ = 0;
                auVar86._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                auVar81 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
                auVar187._8_8_ = 0;
                auVar187._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
                auVar38 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar187);
                auVar25 = vshufps_avx(auVar38,auVar187,0xd8);
                auVar238._8_8_ = 0;
                auVar238._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                auVar38 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar238);
                auVar117 = vshufps_avx(auVar38,auVar238,0xd8);
                fVar339 = *(float *)(pcVar7 + lVar22 + 0x24);
                fVar347 = *(float *)(pcVar7 + lVar22 + 0x28);
                fVar348 = *(float *)(pcVar7 + lVar22 + 0x2c);
                fVar350 = *(float *)(pcVar7 + lVar22 + 0x30);
                auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar347 * fVar347)),ZEXT416((uint)fVar339),
                                          ZEXT416((uint)fVar339));
                auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar348),ZEXT416((uint)fVar348));
                auVar59 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar350),ZEXT416((uint)fVar350));
                auVar38 = vrsqrtss_avx(auVar59,auVar59);
                fVar204 = auVar38._0_4_;
                fVar204 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar59._0_4_ * -0.5;
                local_138 = vinsertps_avx(auVar117,ZEXT416((uint)(fVar204 * fVar339)),0x30);
                local_108 = vinsertps_avx(auVar25,ZEXT416((uint)(fVar204 * fVar347)),0x30);
                auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
                local_128 = vinsertps_avx(auVar81,ZEXT416((uint)(fVar350 * fVar204)),0x30);
                auVar81 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
                local_118 = vinsertps_avx(auVar81,ZEXT416((uint)(fVar348 * fVar204)),0x30);
              }
              else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar7 = pRVar1->ptr_ofs;
                lVar22 = pRVar1->stride * uVar19;
                local_108 = *(undefined1 (*) [16])(pcVar7 + lVar22);
                local_118 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
                local_128 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20);
                local_138 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30);
              }
              auVar37 = vpand_avx(auVar37,_local_3a8);
              uVar23 = local_108._0_4_;
              auVar343._4_4_ = uVar23;
              auVar343._0_4_ = uVar23;
              auVar343._8_4_ = uVar23;
              auVar343._12_4_ = uVar23;
              auVar81 = vshufps_avx(local_108,local_108,0x55);
              local_88 = vshufps_avx(local_108,local_108,0xaa);
              auVar38 = vshufps_avx(local_108,local_108,0xff);
              local_98._4_4_ = local_118._0_4_;
              local_98._0_4_ = local_98._4_4_;
              local_98._8_4_ = local_98._4_4_;
              local_98._12_4_ = local_98._4_4_;
              local_a8 = vshufps_avx(local_118,local_118,0x55);
              auVar25 = vshufps_avx(local_118,local_118,0xaa);
              auVar117 = vshufps_avx(local_118,local_118,0xff);
              uVar23 = local_128._0_4_;
              auVar291._4_4_ = uVar23;
              auVar291._0_4_ = uVar23;
              auVar291._8_4_ = uVar23;
              auVar291._12_4_ = uVar23;
              auVar59 = vshufps_avx(local_128,local_128,0x55);
              auVar82 = vshufps_avx(local_128,local_128,0xaa);
              auVar83 = vshufps_avx(local_128,local_128,0xff);
              local_b8._4_4_ = local_138._0_4_;
              local_b8._0_4_ = local_b8._4_4_;
              local_b8._8_4_ = local_b8._4_4_;
              local_b8._12_4_ = local_b8._4_4_;
              local_68 = vshufps_avx(local_138,local_138,0x55);
              local_78 = vshufps_avx(local_138,local_138,0xaa);
              RVar4 = pRVar1[1].format;
              auVar84 = vshufps_avx(local_138,local_138,0xff);
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = pRVar1[1].stride * uVar19;
                auVar85 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
                local_1f8 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28);
                auVar85 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
                local_208 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
                auVar85 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
                local_228 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
                auVar85 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
                local_218 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = pRVar1[1].stride * uVar19;
                auVar87._8_8_ = 0;
                auVar87._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
                auVar85 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar87,0x4c);
                local_1f8 = vshufps_avx(auVar85,auVar85,0x78);
                auVar88._8_8_ = 0;
                auVar88._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                auVar85 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar88,0x4c);
                local_208 = vshufps_avx(auVar85,auVar85,0x78);
                auVar89._8_8_ = 0;
                auVar89._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                auVar85 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar89,0x4c);
                local_228 = vshufps_avx(auVar85,auVar85,0x78);
                auVar90._8_8_ = 0;
                auVar90._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
                auVar85 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar90,0x4c);
                local_218 = vshufps_avx(auVar85,auVar85,0x78);
              }
              else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = pRVar1[1].stride * uVar19;
                auVar91._8_8_ = 0;
                auVar91._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                auVar85 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
                auVar92._8_8_ = 0;
                auVar92._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
                auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar92);
                auVar187 = vshufps_avx(auVar86,auVar92,0xd8);
                auVar93._8_8_ = 0;
                auVar93._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar93);
                auVar238 = vshufps_avx(auVar86,auVar93,0xd8);
                fVar339 = *(float *)(pcVar7 + lVar22 + 0x24);
                fVar347 = *(float *)(pcVar7 + lVar22 + 0x28);
                fVar348 = *(float *)(pcVar7 + lVar22 + 0x2c);
                fVar350 = *(float *)(pcVar7 + lVar22 + 0x30);
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar347 * fVar347)),ZEXT416((uint)fVar339),
                                          ZEXT416((uint)fVar339));
                auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar348),ZEXT416((uint)fVar348));
                auVar87 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar350),ZEXT416((uint)fVar350));
                auVar86 = vrsqrtss_avx(auVar87,auVar87);
                fVar204 = auVar86._0_4_;
                fVar204 = fVar204 * 1.5 + fVar204 * fVar204 * fVar204 * auVar87._0_4_ * -0.5;
                local_218 = vinsertps_avx(auVar238,ZEXT416((uint)(fVar339 * fVar204)),0x30);
                local_1f8 = vinsertps_avx(auVar187,ZEXT416((uint)(fVar347 * fVar204)),0x30);
                auVar86 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
                local_228 = vinsertps_avx(auVar85,ZEXT416((uint)(fVar350 * fVar204)),0x30);
                auVar85 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
                local_208 = vinsertps_avx(auVar85,ZEXT416((uint)(fVar348 * fVar204)),0x30);
              }
              else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = pRVar1[1].stride * uVar19;
                local_1f8 = *(undefined1 (*) [16])(pcVar7 + lVar22);
                local_208 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
                local_228 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20);
                local_218 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30);
              }
              local_378 = vblendvps_avx(local_378,auVar343,auVar37);
              _local_388 = vblendvps_avx(_local_388,auVar81,auVar37);
              _local_358 = vblendvps_avx(_local_358,local_88,auVar37);
              _local_2e8 = vblendvps_avx(_local_2e8,auVar38,auVar37);
              local_308 = vblendvps_avx(local_308,local_98,auVar37);
              _local_368 = vblendvps_avx(_local_368,local_a8,auVar37);
              _local_2d8 = vblendvps_avx(_local_2d8,auVar25,auVar37);
              _local_2b8 = vblendvps_avx(_local_2b8,auVar117,auVar37);
              local_318 = vblendvps_avx(local_318,auVar291,auVar37);
              _local_348 = vblendvps_avx(_local_348,auVar59,auVar37);
              _local_2c8 = vblendvps_avx(_local_2c8,auVar82,auVar37);
              _local_268 = vblendvps_avx(_local_268,auVar83,auVar37);
              _local_398 = vblendvps_avx(_local_398,local_b8,auVar37);
              _local_328 = vblendvps_avx(_local_328,local_68,auVar37);
              _local_338 = vblendvps_avx(_local_338,local_78,auVar37);
              _local_2f8 = vblendvps_avx(_local_2f8,auVar84,auVar37);
              uVar23 = local_1f8._0_4_;
              auVar94._4_4_ = uVar23;
              auVar94._0_4_ = uVar23;
              auVar94._8_4_ = uVar23;
              auVar94._12_4_ = uVar23;
              _local_e8 = vblendvps_avx(_local_e8,auVar94,auVar37);
              auVar81 = vshufps_avx(local_1f8,local_1f8,0x55);
              _local_1b8 = vblendvps_avx(_local_1b8,auVar81,auVar37);
              auVar81 = vshufps_avx(local_1f8,local_1f8,0xaa);
              _local_1a8 = vblendvps_avx(_local_1a8,auVar81,auVar37);
              auVar81 = vshufps_avx(local_1f8,local_1f8,0xff);
              local_1c8 = vblendvps_avx(local_1c8,auVar81,auVar37);
              uVar23 = local_208._0_4_;
              auVar95._4_4_ = uVar23;
              auVar95._0_4_ = uVar23;
              auVar95._8_4_ = uVar23;
              auVar95._12_4_ = uVar23;
              _local_198 = vblendvps_avx(_local_198,auVar95,auVar37);
              auVar81 = vshufps_avx(local_208,local_208,0x55);
              _local_188 = vblendvps_avx(_local_188,auVar81,auVar37);
              auVar81 = vshufps_avx(local_208,local_208,0xaa);
              _local_298 = vblendvps_avx(_local_298,auVar81,auVar37);
              auVar81 = vshufps_avx(local_208,local_208,0xff);
              local_1d8 = vblendvps_avx(local_1d8,auVar81,auVar37);
              uVar23 = local_228._0_4_;
              auVar96._4_4_ = uVar23;
              auVar96._0_4_ = uVar23;
              auVar96._8_4_ = uVar23;
              auVar96._12_4_ = uVar23;
              _local_178 = vblendvps_avx(_local_178,auVar96,auVar37);
              auVar81 = vshufps_avx(local_228,local_228,0x55);
              _local_288 = vblendvps_avx(_local_288,auVar81,auVar37);
              auVar81 = vshufps_avx(local_228,local_228,0xaa);
              _local_278 = vblendvps_avx(_local_278,auVar81,auVar37);
              auVar81 = vshufps_avx(local_228,local_228,0xff);
              local_f8 = vblendvps_avx(local_f8,auVar81,auVar37);
              uVar23 = local_218._0_4_;
              auVar97._4_4_ = uVar23;
              auVar97._0_4_ = uVar23;
              auVar97._8_4_ = uVar23;
              auVar97._12_4_ = uVar23;
              _local_238 = vblendvps_avx(_local_238,auVar97,auVar37);
              auVar81 = vshufps_avx(local_218,local_218,0x55);
              _local_248 = vblendvps_avx(_local_248,auVar81,auVar37);
              auVar81 = vshufps_avx(local_218,local_218,0xaa);
              _local_258 = vblendvps_avx(_local_258,auVar81,auVar37);
              auVar81 = vshufps_avx(local_218,local_218,0xff);
              local_1e8 = vblendvps_avx(local_1e8,auVar81,auVar37);
              local_3a8._4_4_ = auVar37._4_4_ ^ local_3a8._4_4_;
              local_3a8._0_4_ = auVar37._0_4_ ^ local_3a8._0_4_;
              fStack_3a0 = (float)(auVar37._8_4_ ^ (uint)fStack_3a0);
              fStack_39c = (float)(auVar37._12_4_ ^ (uint)fStack_39c);
            }
            auVar98._0_4_ =
                 local_f8._0_4_ * (float)local_268._0_4_ +
                 local_1d8._0_4_ * (float)local_2b8._0_4_ +
                 local_2e8._0_4_ * local_1c8._0_4_ + local_1e8._0_4_ * local_2f8._0_4_;
            auVar98._4_4_ =
                 local_f8._4_4_ * (float)local_268._4_4_ +
                 local_1d8._4_4_ * (float)local_2b8._4_4_ +
                 local_2e8._4_4_ * local_1c8._4_4_ + local_1e8._4_4_ * local_2f8._4_4_;
            auVar98._8_4_ =
                 local_f8._8_4_ * fStack_260 +
                 local_1d8._8_4_ * fStack_2b0 +
                 local_2e8._8_4_ * local_1c8._8_4_ + local_1e8._8_4_ * local_2f8._8_4_;
            auVar98._12_4_ =
                 local_f8._12_4_ * fStack_25c +
                 local_1d8._12_4_ * fStack_2ac +
                 local_2e8._12_4_ * local_1c8._12_4_ + local_1e8._12_4_ * local_2f8._12_4_;
            uVar19 = CONCAT44(auVar98._4_4_,auVar98._0_4_);
            auVar52._0_8_ = uVar19 ^ 0x8000000080000000;
            auVar52._8_4_ = -auVar98._8_4_;
            auVar52._12_4_ = -auVar98._12_4_;
            auVar37 = vcmpps_avx(auVar98,auVar52,1);
            auVar149._0_8_ = local_1e8._0_8_ ^ 0x8000000080000000;
            auVar149._8_4_ = -local_1e8._8_4_;
            auVar149._12_4_ = -local_1e8._12_4_;
            auVar81 = vblendvps_avx(local_1e8,auVar149,auVar37);
            auVar150._0_8_ = local_1c8._0_8_ ^ 0x8000000080000000;
            auVar150._8_4_ = -local_1c8._8_4_;
            auVar150._12_4_ = -local_1c8._12_4_;
            auVar38 = vblendvps_avx(local_1c8,auVar150,auVar37);
            auVar151._0_8_ = local_1d8._0_8_ ^ 0x8000000080000000;
            auVar151._8_4_ = -local_1d8._8_4_;
            auVar151._12_4_ = -local_1d8._12_4_;
            auVar25 = vblendvps_avx(local_1d8,auVar151,auVar37);
            auVar152._0_8_ = local_f8._0_8_ ^ 0x8000000080000000;
            auVar152._8_4_ = -local_f8._8_4_;
            auVar152._12_4_ = -local_f8._12_4_;
            auVar117 = vblendvps_avx(local_f8,auVar152,auVar37);
            auVar84 = vmaxps_avx(auVar52,auVar98);
            auVar153._8_4_ = 0x7fffffff;
            auVar153._0_8_ = 0x7fffffff7fffffff;
            auVar153._12_4_ = 0x7fffffff;
            auVar37 = vandps_avx(auVar98,auVar153);
            fVar339 = auVar37._0_4_;
            fVar347 = auVar37._4_4_;
            fVar348 = auVar37._8_4_;
            fVar350 = auVar37._12_4_;
            auVar154._8_4_ = 0x3f800000;
            auVar154._0_8_ = 0x3f8000003f800000;
            auVar154._12_4_ = 0x3f800000;
            auVar59 = vsubps_avx(auVar154,auVar37);
            auVar59 = vsqrtps_avx(auVar59);
            auVar188._0_4_ =
                 auVar59._0_4_ *
                 (fVar339 * (fVar339 * (fVar339 * (fVar339 * (fVar339 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar188._4_4_ =
                 auVar59._4_4_ *
                 (fVar347 * (fVar347 * (fVar347 * (fVar347 * (fVar347 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar188._8_4_ =
                 auVar59._8_4_ *
                 (fVar348 * (fVar348 * (fVar348 * (fVar348 * (fVar348 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar188._12_4_ =
                 auVar59._12_4_ *
                 (fVar350 * (fVar350 * (fVar350 * (fVar350 * (fVar350 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar292._8_4_ = 0x3fc90fdb;
            auVar292._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar292._12_4_ = 0x3fc90fdb;
            auVar59 = vsubps_avx(auVar292,auVar188);
            auVar85 = ZEXT816(0) << 0x20;
            auVar82 = vmaxps_avx(auVar85,auVar59);
            auVar59 = vcmpps_avx(auVar84,auVar85,1);
            auVar314._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
            auVar314._8_4_ = auVar82._8_4_ ^ 0x80000000;
            auVar314._12_4_ = auVar82._12_4_ ^ 0x80000000;
            auVar59 = vblendvps_avx(auVar82,auVar314,auVar59);
            auVar37 = vcmpps_avx(auVar37,auVar154,6);
            auVar59 = vsubps_avx(auVar292,auVar59);
            auVar304._8_4_ = 0x7fc00000;
            auVar304._0_8_ = 0x7fc000007fc00000;
            auVar304._12_4_ = 0x7fc00000;
            auVar37 = vblendvps_avx(auVar59,auVar304,auVar37);
            auVar189._0_4_ = fVar137 * auVar37._0_4_;
            auVar189._4_4_ = fVar160 * auVar37._4_4_;
            auVar189._8_4_ = fVar161 * auVar37._8_4_;
            auVar189._12_4_ = fVar162 * auVar37._12_4_;
            auVar99._0_4_ = auVar189._0_4_ * 0.63661975;
            auVar99._4_4_ = auVar189._4_4_ * 0.63661975;
            auVar99._8_4_ = auVar189._8_4_ * 0.63661975;
            auVar99._12_4_ = auVar189._12_4_ * 0.63661975;
            auVar37 = vroundps_avx(auVar99,1);
            auVar293._0_4_ = auVar37._0_4_ * 1.5707964;
            auVar293._4_4_ = auVar37._4_4_ * 1.5707964;
            auVar293._8_4_ = auVar37._8_4_ * 1.5707964;
            auVar293._12_4_ = auVar37._12_4_ * 1.5707964;
            auVar59 = vsubps_avx(auVar189,auVar293);
            fVar339 = auVar59._0_4_;
            fVar204 = fVar339 * fVar339;
            fVar347 = auVar59._4_4_;
            fVar225 = fVar347 * fVar347;
            fVar348 = auVar59._8_4_;
            fVar227 = fVar348 * fVar348;
            fVar350 = auVar59._12_4_;
            fVar229 = fVar350 * fVar350;
            auVar315._0_4_ =
                 fVar339 * (fVar204 * (fVar204 * (fVar204 * (fVar204 * (fVar204 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar315._4_4_ =
                 fVar347 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar315._8_4_ =
                 fVar348 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar315._12_4_ =
                 fVar350 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar83 = vcvtps2dq_avx(auVar37);
            auVar323._8_4_ = 1;
            auVar323._0_8_ = 0x100000001;
            auVar323._12_4_ = 1;
            auVar37 = vandpd_avx(auVar323,auVar83);
            auVar82 = vpcmpeqd_avx(auVar37,auVar85);
            auVar37 = vpsubd_avx(auVar85,auVar37);
            auVar305._0_4_ =
                 fVar204 * (fVar204 * (fVar204 * (fVar204 * (fVar204 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar305._4_4_ =
                 fVar225 * (fVar225 * (fVar225 * (fVar225 * (fVar225 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar305._8_4_ =
                 fVar227 * (fVar227 * (fVar227 * (fVar227 * (fVar227 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar305._12_4_ =
                 fVar229 * (fVar229 * (fVar229 * (fVar229 * (fVar229 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar59 = vblendvps_avx(auVar315,auVar305,auVar37);
            auVar82 = vblendvps_avx(auVar315,auVar305,auVar82);
            auVar316._8_4_ = 3;
            auVar316._0_8_ = 0x300000003;
            auVar316._12_4_ = 3;
            auVar37 = vandpd_avx(auVar316,auVar83);
            auVar83 = vpcmpeqd_avx(auVar83,auVar83);
            auVar83 = vpaddd_avx(auVar37,auVar83);
            auVar85 = vpminud_avx(auVar83,auVar323);
            auVar83 = vpcmpeqd_avx(auVar85,auVar83);
            auVar337._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
            auVar337._8_4_ = auVar82._8_4_ ^ 0x80000000;
            auVar337._12_4_ = auVar82._12_4_ ^ 0x80000000;
            auVar82 = vblendvps_avx(auVar82,auVar337,auVar83);
            auVar37 = vpcmpgtd_avx(auVar37,auVar323);
            auVar220._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
            auVar220._8_4_ = auVar59._8_4_ ^ 0x80000000;
            auVar220._12_4_ = auVar59._12_4_ ^ 0x80000000;
            auVar37 = vblendvps_avx(auVar220,auVar59,auVar37);
            auVar59 = vfmsub213ps_fma(_local_2f8,auVar84,auVar81);
            auVar83 = vfmsub213ps_fma(_local_2e8,auVar84,auVar38);
            fVar339 = auVar59._0_4_;
            fVar225 = auVar59._4_4_;
            fVar228 = auVar59._8_4_;
            fVar349 = auVar59._12_4_;
            fVar347 = auVar83._0_4_;
            fVar227 = auVar83._4_4_;
            fVar230 = auVar83._8_4_;
            fVar11 = auVar83._12_4_;
            auVar59 = vfmsub213ps_fma(_local_2b8,auVar84,auVar25);
            fVar348 = auVar59._0_4_;
            fVar229 = auVar59._4_4_;
            fVar8 = auVar59._8_4_;
            fVar12 = auVar59._12_4_;
            auVar59 = vfmsub213ps_fma(_local_268,auVar84,auVar117);
            fVar350 = auVar59._0_4_;
            fVar205 = auVar59._4_4_;
            fVar9 = auVar59._8_4_;
            fVar13 = auVar59._12_4_;
            auVar294._0_4_ =
                 fVar350 * fVar350 + fVar348 * fVar348 + fVar339 * fVar339 + fVar347 * fVar347;
            auVar294._4_4_ =
                 fVar205 * fVar205 + fVar229 * fVar229 + fVar225 * fVar225 + fVar227 * fVar227;
            auVar294._8_4_ = fVar9 * fVar9 + fVar8 * fVar8 + fVar228 * fVar228 + fVar230 * fVar230;
            auVar294._12_4_ =
                 fVar13 * fVar13 + fVar12 * fVar12 + fVar349 * fVar349 + fVar11 * fVar11;
            auVar59 = vrsqrtps_avx(auVar294);
            fVar204 = auVar59._0_4_;
            fVar226 = auVar59._4_4_;
            fVar10 = auVar59._8_4_;
            fVar14 = auVar59._12_4_;
            auVar155._0_4_ = auVar294._0_4_ * -0.5 * fVar204 * fVar204 * fVar204;
            auVar155._4_4_ = auVar294._4_4_ * -0.5 * fVar226 * fVar226 * fVar226;
            auVar155._8_4_ = auVar294._8_4_ * -0.5 * fVar10 * fVar10 * fVar10;
            auVar155._12_4_ = auVar294._12_4_ * -0.5 * fVar14 * fVar14 * fVar14;
            auVar295._8_4_ = 0x3fc00000;
            auVar295._0_8_ = 0x3fc000003fc00000;
            auVar295._12_4_ = 0x3fc00000;
            auVar59 = vfmadd231ps_fma(auVar155,auVar295,auVar59);
            fVar204 = auVar59._0_4_;
            fVar226 = auVar59._4_4_;
            fVar10 = auVar59._8_4_;
            fVar14 = auVar59._12_4_;
            fVar318 = auVar37._0_4_;
            auVar221._0_4_ = fVar318 * fVar339 * fVar204;
            fVar339 = auVar37._4_4_;
            auVar221._4_4_ = fVar339 * fVar225 * fVar226;
            fVar225 = auVar37._8_4_;
            auVar221._8_4_ = fVar225 * fVar228 * fVar10;
            fVar228 = auVar37._12_4_;
            auVar221._12_4_ = fVar228 * fVar349 * fVar14;
            auVar306._0_4_ = fVar347 * fVar204 * fVar318;
            auVar306._4_4_ = fVar227 * fVar226 * fVar339;
            auVar306._8_4_ = fVar230 * fVar10 * fVar225;
            auVar306._12_4_ = fVar11 * fVar14 * fVar228;
            auVar317._0_4_ = fVar348 * fVar204 * fVar318;
            auVar317._4_4_ = fVar229 * fVar226 * fVar339;
            auVar317._8_4_ = fVar8 * fVar10 * fVar225;
            auVar317._12_4_ = fVar12 * fVar14 * fVar228;
            auVar324._0_4_ = fVar318 * fVar350 * fVar204;
            auVar324._4_4_ = fVar339 * fVar205 * fVar226;
            auVar324._8_4_ = fVar225 * fVar9 * fVar10;
            auVar324._12_4_ = fVar228 * fVar13 * fVar14;
            auVar59 = vfmadd231ps_fma(auVar221,auVar82,_local_2f8);
            auVar83 = vfmadd231ps_fma(auVar306,auVar82,_local_2e8);
            auVar85 = vfmadd231ps_fma(auVar317,auVar82,_local_2b8);
            auVar82 = vfmadd231ps_fma(auVar324,_local_268,auVar82);
            auVar37 = vsubps_avx(auVar81,_local_2f8);
            auVar81 = vfmadd213ps_fma(auVar37,auVar39,_local_2f8);
            auVar37 = vsubps_avx(auVar38,_local_2e8);
            auVar38 = vfmadd213ps_fma(auVar37,auVar39,_local_2e8);
            auVar37 = vsubps_avx(auVar25,_local_2b8);
            auVar25 = vfmadd213ps_fma(auVar37,auVar39,_local_2b8);
            auVar37 = vsubps_avx(auVar117,_local_268);
            auVar37 = vfmadd213ps_fma(auVar37,auVar39,_local_268);
            fVar339 = auVar81._0_4_;
            fVar225 = auVar81._4_4_;
            fVar228 = auVar81._8_4_;
            fVar349 = auVar81._12_4_;
            fVar347 = auVar38._0_4_;
            fVar227 = auVar38._4_4_;
            fVar230 = auVar38._8_4_;
            fVar11 = auVar38._12_4_;
            fVar348 = auVar25._0_4_;
            fVar229 = auVar25._4_4_;
            fVar8 = auVar25._8_4_;
            fVar12 = auVar25._12_4_;
            fVar350 = auVar37._0_4_;
            fVar205 = auVar37._4_4_;
            fVar9 = auVar37._8_4_;
            fVar13 = auVar37._12_4_;
            auVar258._0_4_ =
                 fVar350 * fVar350 + fVar348 * fVar348 + fVar347 * fVar347 + fVar339 * fVar339;
            auVar258._4_4_ =
                 fVar205 * fVar205 + fVar229 * fVar229 + fVar227 * fVar227 + fVar225 * fVar225;
            auVar258._8_4_ = fVar9 * fVar9 + fVar8 * fVar8 + fVar230 * fVar230 + fVar228 * fVar228;
            auVar258._12_4_ =
                 fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11 + fVar349 * fVar349;
            auVar37 = vrsqrtps_avx(auVar258);
            fVar204 = auVar37._0_4_;
            fVar226 = auVar37._4_4_;
            fVar10 = auVar37._8_4_;
            fVar14 = auVar37._12_4_;
            auVar190._0_4_ = fVar204 * fVar204 * auVar258._0_4_ * -0.5 * fVar204;
            auVar190._4_4_ = fVar226 * fVar226 * auVar258._4_4_ * -0.5 * fVar226;
            auVar190._8_4_ = fVar10 * fVar10 * auVar258._8_4_ * -0.5 * fVar10;
            auVar190._12_4_ = fVar14 * fVar14 * auVar258._12_4_ * -0.5 * fVar14;
            auVar37 = vfmadd231ps_fma(auVar190,auVar37,auVar295);
            fVar204 = auVar37._0_4_;
            auVar100._0_4_ = fVar339 * fVar204;
            fVar339 = auVar37._4_4_;
            auVar100._4_4_ = fVar225 * fVar339;
            fVar225 = auVar37._8_4_;
            auVar100._8_4_ = fVar228 * fVar225;
            fVar226 = auVar37._12_4_;
            auVar100._12_4_ = fVar349 * fVar226;
            auVar156._0_4_ = fVar347 * fVar204;
            auVar156._4_4_ = fVar227 * fVar339;
            auVar156._8_4_ = fVar230 * fVar225;
            auVar156._12_4_ = fVar11 * fVar226;
            auVar239._0_4_ = fVar348 * fVar204;
            auVar239._4_4_ = fVar229 * fVar339;
            auVar239._8_4_ = fVar8 * fVar225;
            auVar239._12_4_ = fVar12 * fVar226;
            auVar191._0_4_ = fVar350 * fVar204;
            auVar191._4_4_ = fVar205 * fVar339;
            auVar191._8_4_ = fVar9 * fVar225;
            auVar191._12_4_ = fVar13 * fVar226;
            auVar133._8_4_ = 0x3f7fdf3b;
            auVar133._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar133._12_4_ = 0x3f7fdf3b;
            auVar25 = vcmpps_avx(auVar84,auVar133,6);
            auVar37 = vblendvps_avx(auVar59,auVar100,auVar25);
            auVar81 = vblendvps_avx(auVar83,auVar156,auVar25);
            auVar38 = vblendvps_avx(auVar85,auVar239,auVar25);
            auVar25 = vblendvps_avx(auVar82,auVar191,auVar25);
            auVar157._8_4_ = 0x3f800000;
            auVar157._0_8_ = 0x3f8000003f800000;
            auVar157._12_4_ = 0x3f800000;
            auVar39 = vsubps_avx(auVar157,auVar39);
            auVar192._0_4_ = fVar137 * (float)local_e8._0_4_;
            auVar192._4_4_ = fVar160 * (float)local_e8._4_4_;
            auVar192._8_4_ = fVar161 * fStack_e0;
            auVar192._12_4_ = fVar162 * fStack_dc;
            auVar59 = vfmadd213ps_fma(local_378,auVar39,auVar192);
            auVar193._0_4_ = fVar137 * (float)local_1b8._0_4_;
            auVar193._4_4_ = fVar160 * (float)local_1b8._4_4_;
            auVar193._8_4_ = fVar161 * fStack_1b0;
            auVar193._12_4_ = fVar162 * fStack_1ac;
            auVar82 = vfmadd213ps_fma(_local_388,auVar39,auVar193);
            auVar194._0_4_ = fVar137 * (float)local_1a8._0_4_;
            auVar194._4_4_ = fVar160 * (float)local_1a8._4_4_;
            auVar194._8_4_ = fVar161 * fStack_1a0;
            auVar194._12_4_ = fVar162 * fStack_19c;
            auVar83 = vfmadd213ps_fma(_local_358,auVar39,auVar194);
            auVar195._0_4_ = fVar137 * (float)local_198._0_4_;
            auVar195._4_4_ = fVar160 * (float)local_198._4_4_;
            auVar195._8_4_ = fVar161 * fStack_190;
            auVar195._12_4_ = fVar162 * fStack_18c;
            auVar84 = vfmadd213ps_fma(local_308,auVar39,auVar195);
            auVar196._0_4_ = fVar137 * (float)local_188._0_4_;
            auVar196._4_4_ = fVar160 * (float)local_188._4_4_;
            auVar196._8_4_ = fVar161 * fStack_180;
            auVar196._12_4_ = fVar162 * fStack_17c;
            auVar85 = vfmadd213ps_fma(_local_368,auVar39,auVar196);
            auVar197._0_4_ = fVar137 * (float)local_298._0_4_;
            auVar197._4_4_ = fVar160 * (float)local_298._4_4_;
            auVar197._8_4_ = fVar161 * fStack_290;
            auVar197._12_4_ = fVar162 * fStack_28c;
            auVar86 = vfmadd213ps_fma(_local_2d8,auVar39,auVar197);
            auVar198._0_4_ = fVar137 * (float)local_178._0_4_;
            auVar198._4_4_ = fVar160 * (float)local_178._4_4_;
            auVar198._8_4_ = fVar161 * fStack_170;
            auVar198._12_4_ = fVar162 * fStack_16c;
            auVar187 = vfmadd213ps_fma(local_318,auVar39,auVar198);
            auVar199._0_4_ = fVar137 * (float)local_288._0_4_;
            auVar199._4_4_ = fVar160 * (float)local_288._4_4_;
            auVar199._8_4_ = fVar161 * fStack_280;
            auVar199._12_4_ = fVar162 * fStack_27c;
            auVar238 = vfmadd213ps_fma(_local_348,auVar39,auVar199);
            auVar200._0_4_ = fVar137 * (float)local_278._0_4_;
            auVar200._4_4_ = fVar160 * (float)local_278._4_4_;
            auVar200._8_4_ = fVar161 * fStack_270;
            auVar200._12_4_ = fVar162 * fStack_26c;
            auVar291 = vfmadd213ps_fma(_local_2c8,auVar39,auVar200);
            auVar201._0_4_ = fVar137 * (float)local_238._0_4_;
            auVar201._4_4_ = fVar160 * (float)local_238._4_4_;
            auVar201._8_4_ = fVar161 * fStack_230;
            auVar201._12_4_ = fVar162 * fStack_22c;
            auVar240._0_4_ = fVar137 * (float)local_248._0_4_;
            auVar240._4_4_ = fVar160 * (float)local_248._4_4_;
            auVar240._8_4_ = fVar161 * fStack_240;
            auVar240._12_4_ = fVar162 * fStack_23c;
            auVar259._0_4_ = fVar137 * (float)local_258._0_4_;
            auVar259._4_4_ = fVar160 * (float)local_258._4_4_;
            auVar259._8_4_ = fVar161 * fStack_250;
            auVar259._12_4_ = fVar162 * fStack_24c;
            auVar343 = vfmadd213ps_fma(_local_398,auVar39,auVar201);
            auVar87 = vfmadd213ps_fma(_local_328,auVar39,auVar240);
            auVar88 = vfmadd213ps_fma(_local_338,auVar39,auVar259);
            fVar137 = auVar38._0_4_;
            fVar205 = auVar81._0_4_;
            auVar202._0_4_ = fVar205 * fVar137;
            fVar161 = auVar38._4_4_;
            fVar226 = auVar81._4_4_;
            auVar202._4_4_ = fVar226 * fVar161;
            fVar339 = auVar38._8_4_;
            fVar228 = auVar81._8_4_;
            auVar202._8_4_ = fVar228 * fVar339;
            fVar348 = auVar38._12_4_;
            fVar230 = auVar81._12_4_;
            auVar202._12_4_ = fVar230 * fVar348;
            fVar160 = auVar25._0_4_;
            fVar204 = auVar37._0_4_;
            auVar241._0_4_ = fVar204 * fVar160;
            fVar162 = auVar25._4_4_;
            fVar225 = auVar37._4_4_;
            auVar241._4_4_ = fVar225 * fVar162;
            fVar347 = auVar25._8_4_;
            fVar227 = auVar37._8_4_;
            auVar241._8_4_ = fVar227 * fVar347;
            fVar350 = auVar25._12_4_;
            fVar229 = auVar37._12_4_;
            auVar241._12_4_ = fVar229 * fVar350;
            auVar37 = vsubps_avx(auVar202,auVar241);
            auVar242._0_4_ = fVar204 * fVar204;
            auVar242._4_4_ = fVar225 * fVar225;
            auVar242._8_4_ = fVar227 * fVar227;
            auVar242._12_4_ = fVar229 * fVar229;
            auVar260._0_4_ = fVar205 * fVar205;
            auVar260._4_4_ = fVar226 * fVar226;
            auVar260._8_4_ = fVar228 * fVar228;
            auVar260._12_4_ = fVar230 * fVar230;
            auVar272._0_4_ = auVar242._0_4_ + auVar260._0_4_;
            auVar272._4_4_ = auVar242._4_4_ + auVar260._4_4_;
            auVar272._8_4_ = auVar242._8_4_ + auVar260._8_4_;
            auVar272._12_4_ = auVar242._12_4_ + auVar260._12_4_;
            auVar81 = vsubps_avx(auVar242,auVar260);
            auVar243._0_4_ = fVar205 * fVar160;
            auVar243._4_4_ = fVar226 * fVar162;
            auVar243._8_4_ = fVar228 * fVar347;
            auVar243._12_4_ = fVar230 * fVar350;
            auVar222._0_4_ = fVar204 * fVar205;
            auVar222._4_4_ = fVar225 * fVar226;
            auVar222._8_4_ = fVar227 * fVar228;
            auVar222._12_4_ = fVar229 * fVar230;
            auVar134._0_4_ = fVar204 * fVar137;
            auVar134._4_4_ = fVar225 * fVar161;
            auVar134._8_4_ = fVar227 * fVar339;
            auVar134._12_4_ = fVar229 * fVar348;
            auVar38 = vsubps_avx(auVar243,auVar134);
            auVar244._0_4_ = fVar137 * fVar160;
            auVar244._4_4_ = fVar161 * fVar162;
            auVar244._8_4_ = fVar339 * fVar347;
            auVar244._12_4_ = fVar348 * fVar350;
            auVar39 = vsubps_avx(auVar244,auVar222);
            auVar53._0_4_ = fVar137 * fVar137;
            auVar53._4_4_ = fVar161 * fVar161;
            auVar53._8_4_ = fVar339 * fVar339;
            auVar53._12_4_ = fVar348 * fVar348;
            auVar25 = vsubps_avx(auVar272,auVar53);
            auVar273._0_4_ = auVar53._0_4_ + auVar81._0_4_;
            auVar273._4_4_ = auVar53._4_4_ + auVar81._4_4_;
            auVar273._8_4_ = auVar53._8_4_ + auVar81._8_4_;
            auVar273._12_4_ = auVar53._12_4_ + auVar81._12_4_;
            auVar81 = vsubps_avx(auVar81,auVar53);
            auVar101._0_4_ = fVar160 * fVar160;
            auVar101._4_4_ = fVar162 * fVar162;
            auVar101._8_4_ = fVar347 * fVar347;
            auVar101._12_4_ = fVar350 * fVar350;
            auVar25 = vsubps_avx(auVar25,auVar101);
            auVar117 = vsubps_avx(auVar273,auVar101);
            auVar54._0_4_ = auVar101._0_4_ + auVar81._0_4_;
            auVar54._4_4_ = auVar101._4_4_ + auVar81._4_4_;
            auVar54._8_4_ = auVar101._8_4_ + auVar81._8_4_;
            auVar54._12_4_ = auVar101._12_4_ + auVar81._12_4_;
            auVar158._0_4_ = auVar202._0_4_ + auVar241._0_4_ + auVar202._0_4_ + auVar241._0_4_;
            auVar158._4_4_ = auVar202._4_4_ + auVar241._4_4_ + auVar202._4_4_ + auVar241._4_4_;
            auVar158._8_4_ = auVar202._8_4_ + auVar241._8_4_ + auVar202._8_4_ + auVar241._8_4_;
            auVar158._12_4_ = auVar202._12_4_ + auVar241._12_4_ + auVar202._12_4_ + auVar241._12_4_;
            auVar102._0_4_ = auVar38._0_4_ + auVar38._0_4_;
            auVar102._4_4_ = auVar38._4_4_ + auVar38._4_4_;
            auVar102._8_4_ = auVar38._8_4_ + auVar38._8_4_;
            auVar102._12_4_ = auVar38._12_4_ + auVar38._12_4_;
            auVar93 = ZEXT416(0) << 0x20;
            auVar261._0_4_ = auVar102._0_4_ * 0.0;
            auVar261._4_4_ = auVar102._4_4_ * 0.0;
            auVar261._8_4_ = auVar102._8_4_ * 0.0;
            auVar261._12_4_ = auVar102._12_4_ * 0.0;
            auVar81 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar158,auVar261);
            auVar325._0_4_ = auVar158._0_4_ + auVar261._0_4_;
            auVar325._4_4_ = auVar158._4_4_ + auVar261._4_4_;
            auVar325._8_4_ = auVar158._8_4_ + auVar261._8_4_;
            auVar325._12_4_ = auVar158._12_4_ + auVar261._12_4_;
            auVar38 = vfmadd213ps_fma(auVar158,auVar93,auVar102);
            auVar103._0_4_ = auVar244._0_4_ + auVar222._0_4_ + auVar244._0_4_ + auVar222._0_4_;
            auVar103._4_4_ = auVar244._4_4_ + auVar222._4_4_ + auVar244._4_4_ + auVar222._4_4_;
            auVar103._8_4_ = auVar244._8_4_ + auVar222._8_4_ + auVar244._8_4_ + auVar222._8_4_;
            auVar103._12_4_ = auVar244._12_4_ + auVar222._12_4_ + auVar244._12_4_ + auVar222._12_4_;
            auVar262._0_4_ = auVar103._0_4_ * 0.0;
            auVar262._4_4_ = auVar103._4_4_ * 0.0;
            auVar262._8_4_ = auVar103._8_4_ * 0.0;
            auVar262._12_4_ = auVar103._12_4_ * 0.0;
            auVar89 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar117,auVar262);
            auVar307._0_4_ = auVar117._0_4_ + auVar262._0_4_;
            auVar307._4_4_ = auVar117._4_4_ + auVar262._4_4_;
            auVar307._8_4_ = auVar117._8_4_ + auVar262._8_4_;
            auVar307._12_4_ = auVar117._12_4_ + auVar262._12_4_;
            auVar117 = vfmadd213ps_fma(auVar117,auVar93,auVar103);
            auVar104._0_4_ = auVar37._0_4_ + auVar37._0_4_;
            auVar104._4_4_ = auVar37._4_4_ + auVar37._4_4_;
            auVar104._8_4_ = auVar37._8_4_ + auVar37._8_4_;
            auVar104._12_4_ = auVar37._12_4_ + auVar37._12_4_;
            auVar263._0_4_ = auVar89._0_4_ + auVar104._0_4_;
            auVar263._4_4_ = auVar89._4_4_ + auVar104._4_4_;
            auVar263._8_4_ = auVar89._8_4_ + auVar104._8_4_;
            auVar263._12_4_ = auVar89._12_4_ + auVar104._12_4_;
            auVar89 = vfmadd231ps_fma(auVar307,auVar104,auVar93);
            auVar90 = vfmadd231ps_fma(auVar117,auVar93,auVar104);
            auVar344._0_4_ = auVar39._0_4_ + auVar39._0_4_;
            auVar344._4_4_ = auVar39._4_4_ + auVar39._4_4_;
            auVar344._8_4_ = auVar39._8_4_ + auVar39._8_4_;
            auVar344._12_4_ = auVar39._12_4_ + auVar39._12_4_;
            auVar105._0_4_ = auVar54._0_4_ * 0.0;
            auVar105._4_4_ = auVar54._4_4_ * 0.0;
            auVar105._8_4_ = auVar54._8_4_ * 0.0;
            auVar105._12_4_ = auVar54._12_4_ * 0.0;
            auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar344,auVar105);
            auVar296._0_4_ = auVar344._0_4_ + auVar105._0_4_;
            auVar296._4_4_ = auVar344._4_4_ + auVar105._4_4_;
            auVar296._8_4_ = auVar344._8_4_ + auVar105._8_4_;
            auVar296._12_4_ = auVar344._12_4_ + auVar105._12_4_;
            auVar39 = vfmadd213ps_fma(auVar344,auVar93,auVar54);
            auVar55._0_4_ = auVar243._0_4_ + auVar134._0_4_ + auVar243._0_4_ + auVar134._0_4_;
            auVar55._4_4_ = auVar243._4_4_ + auVar134._4_4_ + auVar243._4_4_ + auVar134._4_4_;
            auVar55._8_4_ = auVar243._8_4_ + auVar134._8_4_ + auVar243._8_4_ + auVar134._8_4_;
            auVar55._12_4_ = auVar243._12_4_ + auVar134._12_4_ + auVar243._12_4_ + auVar134._12_4_;
            fVar339 = auVar55._0_4_ + auVar37._0_4_;
            fVar347 = auVar55._4_4_ + auVar37._4_4_;
            fVar348 = auVar55._8_4_ + auVar37._8_4_;
            fVar350 = auVar55._12_4_ + auVar37._12_4_;
            auVar117 = vfmadd231ps_fma(auVar296,auVar55,auVar93);
            auVar39 = vfmadd231ps_fma(auVar39,auVar93,auVar55);
            auVar91 = vfmadd231ps_fma(auVar325,auVar25,auVar93);
            auVar92 = vfmadd231ps_fma(auVar38,auVar93,auVar25);
            local_388._0_4_ = auVar82._0_4_;
            local_388._4_4_ = auVar82._4_4_;
            fStack_380 = auVar82._8_4_;
            fStack_37c = auVar82._12_4_;
            local_358._0_4_ = auVar83._0_4_;
            local_358._4_4_ = auVar83._4_4_;
            fStack_350 = auVar83._8_4_;
            fStack_34c = auVar83._12_4_;
            local_2d8._0_4_ = auVar86._0_4_;
            local_2d8._4_4_ = auVar86._4_4_;
            fStack_2d0 = auVar86._8_4_;
            fStack_2cc = auVar86._12_4_;
            auVar282._0_4_ = fVar339 * 0.0;
            auVar282._4_4_ = fVar347 * 0.0;
            auVar282._8_4_ = fVar348 * 0.0;
            auVar282._12_4_ = fVar350 * 0.0;
            auVar37 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar263,auVar282);
            fVar137 = auVar117._0_4_;
            auVar274._0_4_ = fVar137 * 0.0;
            fVar160 = auVar117._4_4_;
            auVar274._4_4_ = fVar160 * 0.0;
            fVar161 = auVar117._8_4_;
            auVar274._8_4_ = fVar161 * 0.0;
            fVar162 = auVar117._12_4_;
            auVar274._12_4_ = fVar162 * 0.0;
            auVar38 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar89,auVar274);
            fVar204 = auVar39._0_4_;
            auVar56._0_4_ = fVar204 * 0.0;
            fVar225 = auVar39._4_4_;
            auVar56._4_4_ = fVar225 * 0.0;
            fVar227 = auVar39._8_4_;
            auVar56._8_4_ = fVar227 * 0.0;
            fVar229 = auVar39._12_4_;
            auVar56._12_4_ = fVar229 * 0.0;
            auVar39 = vfmadd213ps_fma(auVar93,auVar90,auVar56);
            auVar82 = vfmadd231ps_fma(auVar282,auVar85,auVar263);
            auVar83 = vfmadd231ps_fma(auVar274,auVar85,auVar89);
            auVar117 = vfmadd213ps_fma(auVar85,auVar90,auVar56);
            local_2c8._0_4_ = auVar291._0_4_;
            local_2c8._4_4_ = auVar291._4_4_;
            fStack_2c0 = auVar291._8_4_;
            fStack_2bc = auVar291._12_4_;
            auVar135._0_4_ = fVar339 * (float)local_2c8._0_4_;
            auVar135._4_4_ = fVar347 * (float)local_2c8._4_4_;
            auVar135._8_4_ = fVar348 * fStack_2c0;
            auVar135._12_4_ = fVar350 * fStack_2bc;
            auVar106._0_4_ = fVar137 * (float)local_2c8._0_4_;
            auVar106._4_4_ = fVar160 * (float)local_2c8._4_4_;
            auVar106._8_4_ = fVar161 * fStack_2c0;
            auVar106._12_4_ = fVar162 * fStack_2bc;
            auVar57._0_4_ = fVar204 * (float)local_2c8._0_4_;
            auVar57._4_4_ = fVar225 * (float)local_2c8._4_4_;
            auVar57._8_4_ = fVar227 * fStack_2c0;
            auVar57._12_4_ = fVar229 * fStack_2bc;
            auVar85 = vfmadd231ps_fma(auVar135,auVar238,auVar263);
            auVar86 = vfmadd231ps_fma(auVar106,auVar238,auVar89);
            auVar238 = vfmadd231ps_fma(auVar57,auVar90,auVar238);
            local_338._0_4_ = auVar88._0_4_;
            local_338._4_4_ = auVar88._4_4_;
            uStack_330._0_4_ = auVar88._8_4_;
            uStack_330._4_4_ = auVar88._12_4_;
            auVar338._0_4_ = fVar339 * (float)local_338._0_4_;
            auVar338._4_4_ = fVar347 * (float)local_338._4_4_;
            auVar338._8_4_ = fVar348 * (float)uStack_330;
            auVar338._12_4_ = fVar350 * uStack_330._4_4_;
            auVar297._0_4_ = fVar137 * (float)local_338._0_4_;
            auVar297._4_4_ = fVar160 * (float)local_338._4_4_;
            auVar297._8_4_ = fVar161 * (float)uStack_330;
            auVar297._12_4_ = fVar162 * uStack_330._4_4_;
            auVar345._0_4_ = fVar204 * (float)local_338._0_4_;
            auVar345._4_4_ = fVar225 * (float)local_338._4_4_;
            auVar345._8_4_ = fVar227 * (float)uStack_330;
            auVar345._12_4_ = fVar229 * uStack_330._4_4_;
            auVar291 = vfmadd231ps_fma(auVar338,auVar87,auVar263);
            auVar88 = vfmadd231ps_fma(auVar297,auVar87,auVar89);
            auVar87 = vfmadd231ps_fma(auVar345,auVar87,auVar90);
            local_2f8._0_4_ = auVar25._0_4_;
            local_2f8._4_4_ = auVar25._4_4_;
            fStack_2f0 = auVar25._8_4_;
            fStack_2ec = auVar25._12_4_;
            local_3a8._0_4_ = auVar81._0_4_;
            local_3a8._4_4_ = auVar81._4_4_;
            fStack_3a0 = auVar81._8_4_;
            fStack_39c = auVar81._12_4_;
            auVar223._0_4_ = (float)local_2f8._0_4_ + (float)local_3a8._0_4_;
            auVar223._4_4_ = (float)local_2f8._4_4_ + (float)local_3a8._4_4_;
            auVar223._8_4_ = fStack_2f0 + fStack_3a0;
            auVar223._12_4_ = fStack_2ec + fStack_39c;
            auVar37 = vfmadd231ps_fma(auVar37,auVar59,auVar223);
            auVar81 = vfmadd231ps_fma(auVar38,auVar59,auVar91);
            auVar38 = vfmadd231ps_fma(auVar39,auVar92,auVar59);
            auVar39 = vfmadd231ps_fma(auVar82,auVar84,auVar223);
            auVar25 = vfmadd231ps_fma(auVar83,auVar84,auVar91);
            auVar117 = vfmadd231ps_fma(auVar117,auVar92,auVar84);
            auVar59 = vfmadd231ps_fma(auVar85,auVar187,auVar223);
            auVar82 = vfmadd231ps_fma(auVar86,auVar187,auVar91);
            auVar83 = vfmadd231ps_fma(auVar238,auVar92,auVar187);
            auVar84 = vfmadd231ps_fma(auVar291,auVar343,auVar223);
            local_3a8._4_4_ = auVar84._4_4_ + (float)local_388._4_4_ + 0.0;
            local_3a8._0_4_ = auVar84._0_4_ + (float)local_388._0_4_ + 0.0;
            fStack_3a0 = auVar84._8_4_ + fStack_380 + 0.0;
            fStack_39c = auVar84._12_4_ + fStack_37c + 0.0;
            auVar84 = vfmadd231ps_fma(auVar88,auVar343,auVar91);
            local_368._4_4_ = auVar84._4_4_ + (float)local_358._4_4_ + 0.0;
            local_368._0_4_ = auVar84._0_4_ + (float)local_358._0_4_ + 0.0;
            fStack_360 = auVar84._8_4_ + fStack_350 + 0.0;
            fStack_35c = auVar84._12_4_ + fStack_34c + 0.0;
            auVar84 = vfmadd231ps_fma(auVar87,auVar343,auVar92);
            fVar137 = auVar84._0_4_ + (float)local_2d8._0_4_ + 0.0;
            fVar160 = auVar84._4_4_ + (float)local_2d8._4_4_ + 0.0;
            fVar161 = auVar84._8_4_ + fStack_2d0 + 0.0;
            fVar162 = auVar84._12_4_ + fStack_2cc + 0.0;
            auVar203._0_4_ = auVar82._0_4_ * auVar117._0_4_;
            auVar203._4_4_ = auVar82._4_4_ * auVar117._4_4_;
            auVar203._8_4_ = auVar82._8_4_ * auVar117._8_4_;
            auVar203._12_4_ = auVar82._12_4_ * auVar117._12_4_;
            auVar84 = vfmsub231ps_fma(auVar203,auVar25,auVar83);
            auVar224._0_4_ = auVar39._0_4_ * auVar83._0_4_;
            auVar224._4_4_ = auVar39._4_4_ * auVar83._4_4_;
            auVar224._8_4_ = auVar39._8_4_ * auVar83._8_4_;
            auVar224._12_4_ = auVar39._12_4_ * auVar83._12_4_;
            auVar85 = vfmsub231ps_fma(auVar224,auVar117,auVar59);
            auVar298._0_4_ = auVar25._0_4_ * auVar59._0_4_;
            auVar298._4_4_ = auVar25._4_4_ * auVar59._4_4_;
            auVar298._8_4_ = auVar25._8_4_ * auVar59._8_4_;
            auVar298._12_4_ = auVar25._12_4_ * auVar59._12_4_;
            auVar86 = vfmsub231ps_fma(auVar298,auVar39,auVar82);
            fVar339 = auVar38._0_4_;
            auVar326._0_4_ = fVar339 * auVar59._0_4_;
            fVar347 = auVar38._4_4_;
            auVar326._4_4_ = fVar347 * auVar59._4_4_;
            fVar348 = auVar38._8_4_;
            auVar326._8_4_ = fVar348 * auVar59._8_4_;
            fVar350 = auVar38._12_4_;
            auVar326._12_4_ = fVar350 * auVar59._12_4_;
            auVar187 = vfmsub231ps_fma(auVar326,auVar37,auVar83);
            auVar346._0_4_ = auVar81._0_4_ * auVar83._0_4_;
            auVar346._4_4_ = auVar81._4_4_ * auVar83._4_4_;
            auVar346._8_4_ = auVar81._8_4_ * auVar83._8_4_;
            auVar346._12_4_ = auVar81._12_4_ * auVar83._12_4_;
            auVar83 = vfmsub231ps_fma(auVar346,auVar82,auVar38);
            auVar308._0_4_ = auVar37._0_4_ * auVar82._0_4_;
            auVar308._4_4_ = auVar37._4_4_ * auVar82._4_4_;
            auVar308._8_4_ = auVar37._8_4_ * auVar82._8_4_;
            auVar308._12_4_ = auVar37._12_4_ * auVar82._12_4_;
            auVar238 = vfmsub231ps_fma(auVar308,auVar81,auVar59);
            auVar136._0_4_ = auVar25._0_4_ * fVar339;
            auVar136._4_4_ = auVar25._4_4_ * fVar347;
            auVar136._8_4_ = auVar25._8_4_ * fVar348;
            auVar136._12_4_ = auVar25._12_4_ * fVar350;
            auVar59 = vfmsub231ps_fma(auVar136,auVar81,auVar117);
            auVar159._0_4_ = auVar37._0_4_ * auVar117._0_4_;
            auVar159._4_4_ = auVar37._4_4_ * auVar117._4_4_;
            auVar159._8_4_ = auVar37._8_4_ * auVar117._8_4_;
            auVar159._12_4_ = auVar37._12_4_ * auVar117._12_4_;
            auVar38 = vfmsub231ps_fma(auVar159,auVar38,auVar39);
            auVar283._0_4_ = auVar39._0_4_ * auVar81._0_4_;
            auVar283._4_4_ = auVar39._4_4_ * auVar81._4_4_;
            auVar283._8_4_ = auVar39._8_4_ * auVar81._8_4_;
            auVar283._12_4_ = auVar39._12_4_ * auVar81._12_4_;
            auVar291 = vfmsub231ps_fma(auVar283,auVar37,auVar25);
            auVar245._0_4_ = fVar339 * auVar86._0_4_;
            auVar245._4_4_ = fVar347 * auVar86._4_4_;
            auVar245._8_4_ = fVar348 * auVar86._8_4_;
            auVar245._12_4_ = fVar350 * auVar86._12_4_;
            auVar81 = vfmadd231ps_fma(auVar245,auVar85,auVar81);
            auVar39 = vfmadd231ps_fma(auVar81,auVar84,auVar37);
            auVar37 = vdivps_avx(auVar84,auVar39);
            auVar117 = vdivps_avx(auVar83,auVar39);
            auVar82 = vdivps_avx(auVar59,auVar39);
            auVar81 = vdivps_avx(auVar85,auVar39);
            auVar25 = vdivps_avx(auVar187,auVar39);
            auVar59 = vdivps_avx(auVar38,auVar39);
            local_378 = vdivps_avx(auVar86,auVar39);
            auVar38 = vdivps_avx(auVar238,auVar39);
            auVar39 = vdivps_avx(auVar291,auVar39);
            auVar281._0_4_ = fVar137 * local_378._0_4_;
            auVar281._4_4_ = fVar160 * local_378._4_4_;
            auVar281._8_4_ = fVar161 * local_378._8_4_;
            auVar281._12_4_ = fVar162 * local_378._12_4_;
            auVar290._0_4_ = auVar38._0_4_ * fVar137;
            auVar290._4_4_ = auVar38._4_4_ * fVar160;
            auVar290._8_4_ = auVar38._8_4_ * fVar161;
            auVar290._12_4_ = auVar38._12_4_ * fVar162;
            auVar313._0_4_ = fVar137 * auVar39._0_4_;
            auVar313._4_4_ = fVar160 * auVar39._4_4_;
            auVar313._8_4_ = fVar161 * auVar39._8_4_;
            auVar313._12_4_ = fVar162 * auVar39._12_4_;
            _local_398 = _local_368;
          }
          auVar83 = vfmadd231ps_fma(auVar281,_local_398,auVar81);
          auVar84 = vfmadd231ps_fma(auVar290,_local_398,auVar25);
          auVar85 = vfmadd231ps_fma(auVar313,auVar59,_local_398);
          auVar83 = vfmadd231ps_fma(auVar83,_local_3a8,auVar37);
          auVar84 = vfmadd231ps_fma(auVar84,_local_3a8,auVar117);
          auVar85 = vfmadd231ps_fma(auVar85,auVar82,_local_3a8);
          auVar301._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
          auVar301._8_4_ = auVar83._8_4_ ^ 0x80000000;
          auVar301._12_4_ = auVar83._12_4_ ^ 0x80000000;
          auVar286._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
          auVar286._8_4_ = auVar84._8_4_ ^ 0x80000000;
          auVar286._12_4_ = auVar84._12_4_ ^ 0x80000000;
          auVar277._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
          auVar277._8_4_ = auVar85._8_4_ ^ 0x80000000;
          auVar277._12_4_ = auVar85._12_4_ ^ 0x80000000;
          _local_3a8 = auVar82;
          _local_398 = auVar59;
          _local_368 = auVar117;
        }
        else {
          fVar137 = (this_00->super_Geometry).time_range.lower;
          auVar26._4_4_ = fVar137;
          auVar26._0_4_ = fVar137;
          auVar26._8_4_ = fVar137;
          auVar26._12_4_ = fVar137;
          fVar160 = (this_00->super_Geometry).fnumTimeSegments;
          auVar138 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar26);
          fVar137 = (this_00->super_Geometry).time_range.upper - fVar137;
          auVar27._4_4_ = fVar137;
          auVar27._0_4_ = fVar137;
          auVar27._8_4_ = fVar137;
          auVar27._12_4_ = fVar137;
          auVar25 = vdivps_avx(auVar138,auVar27);
          auVar28._0_4_ = fVar160 * auVar25._0_4_;
          auVar28._4_4_ = fVar160 * auVar25._4_4_;
          auVar28._8_4_ = fVar160 * auVar25._8_4_;
          auVar28._12_4_ = fVar160 * auVar25._12_4_;
          auVar25 = vroundps_avx(auVar28,1);
          fVar160 = fVar160 + -1.0;
          auVar107._4_4_ = fVar160;
          auVar107._0_4_ = fVar160;
          auVar107._8_4_ = fVar160;
          auVar107._12_4_ = fVar160;
          auVar25 = vminps_avx(auVar25,auVar107);
          auVar25 = vmaxps_avx(auVar25,ZEXT416(0) << 0x20);
          auVar117 = vsubps_avx(auVar28,auVar25);
          local_d8 = vcvtps2dq_avx(auVar25);
          uVar15 = 0;
          for (uVar20 = uVar20 & 0xff; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
            uVar15 = uVar15 + 1;
          }
          iVar3 = *(int *)(local_d8 + (ulong)uVar15 * 4);
          auVar29._4_4_ = iVar3;
          auVar29._0_4_ = iVar3;
          auVar29._8_4_ = iVar3;
          auVar29._12_4_ = iVar3;
          auVar25 = vpcmpeqd_avx(local_d8,auVar29);
          auVar82 = local_58 & ~auVar25;
          auVar265 = local_58;
          auVar59 = local_58;
          if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar82[0xf]) {
            pRVar6 = (this_00->l2w_buf).items;
            pRVar1 = pRVar6 + iVar3;
            RVar4 = pRVar6[iVar3].format;
            if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
              auVar25 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28);
              auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
              auVar138 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
              auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
              auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
              auVar81 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
              auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
              auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar30,0x4c);
              auVar25 = vshufps_avx(auVar37,auVar37,0x78);
              auVar108._8_8_ = 0;
              auVar108._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar108,0x4c);
              auVar138 = vshufps_avx(auVar37,auVar37,0x78);
              auVar109._8_8_ = 0;
              auVar109._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar109,0x4c);
              auVar37 = vshufps_avx(auVar37,auVar37,0x78);
              auVar110._8_8_ = 0;
              auVar110._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
              auVar81 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar110,0x4c);
              auVar81 = vshufps_avx(auVar81,auVar81,0x78);
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar37 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
              auVar81 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar32);
              auVar25 = vshufps_avx(auVar81,auVar32,0xd8);
              auVar206._8_8_ = 0;
              auVar206._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar81 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar206);
              auVar59 = vshufps_avx(auVar81,auVar206,0xd8);
              fVar137 = *(float *)(pcVar7 + lVar22 + 0x24);
              fVar160 = *(float *)(pcVar7 + lVar22 + 0x28);
              fVar161 = *(float *)(pcVar7 + lVar22 + 0x2c);
              fVar162 = *(float *)(pcVar7 + lVar22 + 0x30);
              auVar39 = ZEXT416((uint)fVar162);
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),ZEXT416((uint)fVar137),
                                        ZEXT416((uint)fVar137));
              auVar81 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar161),ZEXT416((uint)fVar161));
              auVar82 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar162),ZEXT416((uint)fVar162));
              auVar81 = vrsqrtss_avx(auVar82,auVar82);
              fVar339 = auVar81._0_4_;
              local_d8 = ZEXT416((uint)(fVar339 * 1.5));
              fVar339 = fVar339 * 1.5 + fVar339 * fVar339 * fVar339 * auVar82._0_4_ * -0.5;
              auVar81 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar339 * fVar137)),0x30);
              auVar25 = vinsertps_avx(auVar25,ZEXT416((uint)(fVar339 * fVar160)),0x30);
              auVar59 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
              auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)(fVar162 * fVar339)),0x30);
              auVar59 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
              auVar138 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar339 * fVar161)),0x30);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar7 = pRVar1->ptr_ofs;
              lVar22 = pRVar1->stride * uVar19;
              auVar25 = *(undefined1 (*) [16])(pcVar7 + lVar22);
              auVar138 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
              auVar37 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20);
              auVar81 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30);
            }
            RVar4 = pRVar1[1].format;
            if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar7 = pRVar1[1].ptr_ofs;
              lVar22 = uVar19 * pRVar1[1].stride;
              auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
              local_d8 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28);
              auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
              auVar59 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
              auVar38 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
              auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
              auVar39 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
              auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
            }
            else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar7 = pRVar1[1].ptr_ofs;
              lVar22 = uVar19 * pRVar1[1].stride;
              auVar111._8_8_ = 0;
              auVar111._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
              auVar38 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar111,0x4c);
              local_d8 = vshufps_avx(auVar38,auVar38,0x78);
              auVar112._8_8_ = 0;
              auVar112._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar38 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar112,0x4c);
              auVar59 = vshufps_avx(auVar38,auVar38,0x78);
              auVar113._8_8_ = 0;
              auVar113._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar38 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar113,0x4c);
              auVar38 = vshufps_avx(auVar38,auVar38,0x78);
              auVar114._8_8_ = 0;
              auVar114._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
              auVar39 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar114,0x4c);
              auVar39 = vshufps_avx(auVar39,auVar39,0x78);
            }
            else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar7 = pRVar1[1].ptr_ofs;
              lVar22 = uVar19 * pRVar1[1].stride;
              auVar115._8_8_ = 0;
              auVar115._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
              auVar38 = vinsertps_avx(auVar115,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
              auVar163._8_8_ = 0;
              auVar163._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
              auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar163);
              auVar59 = vshufps_avx(auVar39,auVar163,0xd8);
              auVar275._8_8_ = 0;
              auVar275._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
              auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar275);
              auVar82 = vshufps_avx(auVar39,auVar275,0xd8);
              fVar137 = *(float *)(pcVar7 + lVar22 + 0x24);
              fVar160 = *(float *)(pcVar7 + lVar22 + 0x28);
              fVar161 = *(float *)(pcVar7 + lVar22 + 0x2c);
              fVar162 = *(float *)(pcVar7 + lVar22 + 0x30);
              auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),ZEXT416((uint)fVar137),
                                        ZEXT416((uint)fVar137));
              auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar161),ZEXT416((uint)fVar161));
              auVar83 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar162),ZEXT416((uint)fVar162));
              auVar39 = vrsqrtss_avx(auVar83,auVar83);
              fVar339 = auVar39._0_4_;
              fVar339 = fVar339 * 1.5 + fVar339 * fVar339 * fVar339 * auVar83._0_4_ * -0.5;
              auVar39 = vinsertps_avx(auVar82,ZEXT416((uint)(fVar137 * fVar339)),0x30);
              local_d8 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar339 * fVar160)),0x30);
              auVar59 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
              auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar162 * fVar339)),0x30);
              auVar59 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
              auVar59 = vinsertps_avx(auVar59,ZEXT416((uint)(fVar161 * fVar339)),0x30);
            }
            else {
              auVar59 = local_58;
              if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = uVar19 * pRVar1[1].stride;
                local_d8 = *(undefined1 (*) [16])(pcVar7 + lVar22);
                auVar59 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
                auVar38 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20);
                auVar39 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30);
              }
            }
            uVar23 = auVar25._0_4_;
            local_2f8._4_4_ = uVar23;
            local_2f8._0_4_ = uVar23;
            fStack_2f0 = (float)uVar23;
            fStack_2ec = (float)uVar23;
            _local_2e8 = vshufps_avx(auVar25,auVar25,0x55);
            local_308 = vshufps_avx(auVar25,auVar25,0xaa);
            local_378._4_4_ = auVar138._0_4_;
            local_378._0_4_ = local_378._4_4_;
            local_378._8_4_ = local_378._4_4_;
            local_378._12_4_ = local_378._4_4_;
            _local_398 = vshufps_avx(auVar138,auVar138,0x55);
            _local_2d8 = vshufps_avx(auVar138,auVar138,0xaa);
            uVar23 = auVar37._0_4_;
            local_2a8._4_4_ = uVar23;
            local_2a8._0_4_ = uVar23;
            local_2a8._8_4_ = uVar23;
            local_2a8._12_4_ = uVar23;
            _local_238 = vshufps_avx(auVar37,auVar37,0x55);
            local_318 = vshufps_avx(auVar37,auVar37,0xaa);
            local_328._4_4_ = auVar81._0_4_;
            local_328._0_4_ = local_328._4_4_;
            uStack_320._0_4_ = (float)local_328._4_4_;
            uStack_320._4_4_ = (float)local_328._4_4_;
            _local_338 = vshufps_avx(auVar81,auVar81,0x55);
            _local_348 = vshufps_avx(auVar81,auVar81,0xaa);
            uVar23 = local_d8._0_4_;
            auVar284._4_4_ = uVar23;
            auVar284._0_4_ = uVar23;
            auVar284._8_4_ = uVar23;
            auVar284._12_4_ = uVar23;
            _local_2b8 = vshufps_avx(local_d8,local_d8,0x55);
            _local_268 = vshufps_avx(local_d8,local_d8,0xaa);
            local_258._0_4_ = auVar59._0_4_;
            _local_248 = vshufps_avx(auVar59,auVar59,0x55);
            auVar25 = vshufps_avx(auVar59,auVar59,0xaa);
            uVar23 = auVar38._0_4_;
            auVar138._4_4_ = uVar23;
            auVar138._0_4_ = uVar23;
            auVar138._8_4_ = uVar23;
            auVar138._12_4_ = uVar23;
            _local_358 = vshufps_avx(auVar38,auVar38,0x55);
            _local_368 = vshufps_avx(auVar38,auVar38,0xaa);
            local_3a8._4_4_ = auVar39._0_4_;
            local_3a8._0_4_ = local_3a8._4_4_;
            fStack_3a0 = (float)local_3a8._4_4_;
            fStack_39c = (float)local_3a8._4_4_;
            _local_388 = vshufps_avx(auVar39,auVar39,0x55);
            auVar81 = vshufps_avx(auVar39,auVar39,0xaa);
            local_258._4_4_ = local_258._0_4_;
            fStack_250 = (float)local_258._0_4_;
            fStack_24c = (float)local_258._0_4_;
          }
          else {
            while( true ) {
              auVar284 = in_ZMM10._0_16_;
              auVar37 = in_ZMM6._0_16_;
              uVar20 = vmovmskps_avx(auVar265);
              _local_3a8 = in_ZMM9._0_16_;
              auVar81 = in_ZMM14._0_16_;
              _local_358 = in_ZMM15._0_16_;
              if (uVar20 == 0) break;
              uVar15 = 0;
              for (uVar20 = uVar20 & 0xff; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar15 = uVar15 + 1;
              }
              iVar3 = *(int *)(local_d8 + (ulong)uVar15 * 4);
              auVar328._4_4_ = iVar3;
              auVar328._0_4_ = iVar3;
              auVar328._8_4_ = iVar3;
              auVar328._12_4_ = iVar3;
              auVar38 = vpcmpeqd_avx(auVar328,local_d8);
              pRVar6 = (this_00->l2w_buf).items;
              pRVar1 = pRVar6 + iVar3;
              RVar4 = pRVar6[iVar3].format;
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar1->ptr_ofs;
                lVar22 = pRVar1->stride * uVar19;
                auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
                local_88 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28);
                auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
                local_98 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
                auVar37 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
                auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
                auVar39 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                        ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
                local_a8 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
LAB_0171b7fc:
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              }
              else {
                if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                  pcVar7 = pRVar1->ptr_ofs;
                  lVar22 = pRVar1->stride * uVar19;
                  auVar118._8_8_ = 0;
                  auVar118._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
                  auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar118,0x4c);
                  local_88 = vshufps_avx(auVar37,auVar37,0x78);
                  auVar119._8_8_ = 0;
                  auVar119._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                  auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar119,0x4c);
                  local_98 = vshufps_avx(auVar37,auVar37,0x78);
                  auVar233._8_8_ = 0;
                  auVar233._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                  auVar37 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar233,0x4c);
                  auVar37 = vshufps_avx(auVar37,auVar37,0x78);
                  auVar247._8_8_ = 0;
                  auVar247._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
                  auVar39 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar247,0x4c);
                  local_a8 = vshufps_avx(auVar39,auVar39,0x78);
                  goto LAB_0171b7fc;
                }
                if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                  pcVar7 = pRVar1->ptr_ofs;
                  lVar22 = pRVar1->stride * uVar19;
                  auVar329._8_8_ = 0;
                  auVar329._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                  auVar37 = vinsertps_avx(auVar329,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
                  auVar168._8_8_ = 0;
                  auVar168._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
                  auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar168);
                  auVar82 = vshufps_avx(auVar39,auVar168,0xd8);
                  auVar169._8_8_ = 0;
                  auVar169._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                  auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar169);
                  auVar83 = vshufps_avx(auVar39,auVar169,0xd8);
                  fVar137 = *(float *)(pcVar7 + lVar22 + 0x24);
                  fVar160 = *(float *)(pcVar7 + lVar22 + 0x28);
                  fVar161 = *(float *)(pcVar7 + lVar22 + 0x2c);
                  fVar162 = *(float *)(pcVar7 + lVar22 + 0x30);
                  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),
                                            ZEXT416((uint)fVar137),ZEXT416((uint)fVar137));
                  auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar161),ZEXT416((uint)fVar161));
                  auVar84 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar162),ZEXT416((uint)fVar162));
                  auVar39 = vrsqrtss_avx(auVar84,auVar84);
                  fVar339 = auVar39._0_4_;
                  fVar339 = fVar339 * fVar339 * auVar84._0_4_ * -0.5 * fVar339 + fVar339 * 1.5;
                  local_a8 = vinsertps_avx(auVar83,ZEXT416((uint)(fVar137 * fVar339)),0x30);
                  local_88 = vinsertps_avx(auVar82,ZEXT416((uint)(fVar160 * fVar339)),0x30);
                  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                          ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
                  auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)(fVar162 * fVar339)),0x30);
                  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
                  local_98 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar161 * fVar339)),0x30);
                }
                else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                  pcVar7 = pRVar1->ptr_ofs;
                  lVar22 = pRVar1->stride * uVar19;
                  local_88 = *(undefined1 (*) [16])(pcVar7 + lVar22);
                  local_98 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
                  auVar37 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20);
                  local_a8 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30);
                }
              }
              auVar38 = vpand_avx(auVar38,auVar265);
              local_298._4_4_ = local_88._0_4_;
              local_298._0_4_ = local_298._4_4_;
              fStack_290 = (float)local_298._4_4_;
              fStack_28c = (float)local_298._4_4_;
              auVar39 = vshufps_avx(local_88,local_88,0x55);
              auVar82 = vshufps_avx(local_88,local_88,0xaa);
              local_1a8._4_4_ = local_98._0_4_;
              local_1a8._0_4_ = local_1a8._4_4_;
              fStack_1a0 = (float)local_1a8._4_4_;
              fStack_19c = (float)local_1a8._4_4_;
              auVar83 = vshufps_avx(local_98,local_98,0x55);
              auVar84 = vshufps_avx(local_98,local_98,0xaa);
              local_1c8._4_4_ = auVar37._0_4_;
              local_1c8._0_4_ = local_1c8._4_4_;
              local_1c8._8_4_ = local_1c8._4_4_;
              local_1c8._12_4_ = local_1c8._4_4_;
              auVar85 = vshufps_avx(auVar37,auVar37,0x55);
              auVar86 = vshufps_avx(auVar37,auVar37,0xaa);
              local_f8._4_4_ = local_a8._0_4_;
              local_f8._0_4_ = local_f8._4_4_;
              local_f8._8_4_ = local_f8._4_4_;
              local_f8._12_4_ = local_f8._4_4_;
              auVar187 = vshufps_avx(local_a8,local_a8,0x55);
              auVar238 = vshufps_avx(local_a8,local_a8,0xaa);
              RVar4 = pRVar1[1].format;
              if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = pRVar1[1].stride * uVar19;
                auVar291 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),
                                         ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x10)),0x1c);
                _local_388 = vinsertps_avx(auVar291,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x20)),0x28)
                ;
                auVar291 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),
                                         ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x14)),0x1c);
                local_158 = vinsertps_avx(auVar291,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),0x28);
                auVar291 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),
                                         ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),0x1c);
                auVar291 = vinsertps_avx(auVar291,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x28)),0x28);
                in_ZMM4 = ZEXT1664(auVar291);
                auVar291 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                         ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x1c)),0x1c);
                auVar291 = vinsertps_avx(auVar291,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x2c)),0x28);
                in_ZMM13 = ZEXT1664(auVar291);
              }
              else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = pRVar1[1].stride * uVar19;
                auVar40._8_8_ = 0;
                auVar40._0_8_ = *(ulong *)(pcVar7 + lVar22 + 4);
                auVar291 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar40,0x4c);
                _local_388 = vshufps_avx(auVar291,auVar291,0x78);
                auVar120._8_8_ = 0;
                auVar120._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                auVar291 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),auVar120,0x4c);
                local_158 = vshufps_avx(auVar291,auVar291,0x78);
                auVar141._8_8_ = 0;
                auVar141._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                auVar291 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar141,0x4c);
                auVar291 = vshufps_avx(auVar291,auVar291,0x78);
                in_ZMM4 = ZEXT1664(auVar291);
                auVar142._8_8_ = 0;
                auVar142._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x28);
                auVar291 = vshufps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x24)),auVar142,0x4c);
                auVar291 = vshufps_avx(auVar291,auVar291,0x78);
                in_ZMM13 = ZEXT1664(auVar291);
              }
              else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar7 = pRVar1[1].ptr_ofs;
                lVar22 = pRVar1[1].stride * uVar19;
                auVar330._8_8_ = 0;
                auVar330._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x10);
                auVar291 = vinsertps_avx(auVar330,ZEXT416(*(uint *)(pcVar7 + lVar22 + 8)),0x20);
                auVar121._8_8_ = 0;
                auVar121._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x34);
                local_b8 = ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc));
                auVar343 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22)),auVar121);
                auVar87 = vshufps_avx(auVar343,auVar121,0xd8);
                auVar122._8_8_ = 0;
                auVar122._0_8_ = *(ulong *)(pcVar7 + lVar22 + 0x1c);
                auVar343 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x18)),auVar122);
                auVar88 = vshufps_avx(auVar343,auVar122,0xd8);
                fVar137 = *(float *)(pcVar7 + lVar22 + 0x24);
                fVar160 = *(float *)(pcVar7 + lVar22 + 0x28);
                fVar161 = *(float *)(pcVar7 + lVar22 + 0x2c);
                fVar162 = *(float *)(pcVar7 + lVar22 + 0x30);
                auVar343 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),ZEXT416((uint)fVar137)
                                           ,ZEXT416((uint)fVar137));
                auVar343 = vfmadd231ss_fma(auVar343,ZEXT416((uint)fVar161),ZEXT416((uint)fVar161));
                auVar89 = vfmadd231ss_fma(auVar343,ZEXT416((uint)fVar162),ZEXT416((uint)fVar162));
                auVar343 = vrsqrtss_avx(auVar89,auVar89);
                fVar339 = auVar343._0_4_;
                fVar339 = fVar339 * fVar339 * auVar89._0_4_ * -0.5 * fVar339 + fVar339 * 1.5;
                auVar343 = vinsertps_avx(auVar88,ZEXT416((uint)(fVar137 * fVar339)),0x30);
                in_ZMM13 = ZEXT1664(auVar343);
                _local_388 = vinsertps_avx(auVar87,ZEXT416((uint)(fVar160 * fVar339)),0x30);
                auVar343 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar22 + 0xc)),
                                         ZEXT416(*(uint *)(pcVar7 + lVar22 + 4)),0x10);
                auVar291 = vinsertps_avx(auVar291,ZEXT416((uint)(fVar162 * fVar339)),0x30);
                in_ZMM4 = ZEXT1664(auVar291);
                auVar291 = vinsertps_avx(auVar343,ZEXT416(*(uint *)(pcVar7 + lVar22 + 0x3c)),0x20);
                local_158 = vinsertps_avx(auVar291,ZEXT416((uint)(fVar161 * fVar339)),0x30);
              }
              else {
                in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                  pcVar7 = pRVar1[1].ptr_ofs;
                  lVar22 = pRVar1[1].stride * uVar19;
                  _local_388 = *(undefined1 (*) [16])(pcVar7 + lVar22);
                  local_158 = *(undefined1 (*) [16])(pcVar7 + lVar22 + 0x10);
                  in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(pcVar7 + lVar22 + 0x20));
                  in_ZMM13 = ZEXT1664(*(undefined1 (*) [16])(pcVar7 + lVar22 + 0x30));
                }
              }
              _local_2f8 = vblendvps_avx(_local_2f8,_local_298,auVar38);
              _local_2e8 = vblendvps_avx(_local_2e8,auVar39,auVar38);
              local_308 = vblendvps_avx(local_308,auVar82,auVar38);
              local_378 = vblendvps_avx(local_378,_local_1a8,auVar38);
              _local_398 = vblendvps_avx(_local_398,auVar83,auVar38);
              _local_2d8 = vblendvps_avx(_local_2d8,auVar84,auVar38);
              local_2a8 = vblendvps_avx(local_2a8,local_1c8,auVar38);
              _local_238 = vblendvps_avx(_local_238,auVar85,auVar38);
              local_318 = vblendvps_avx(local_318,auVar86,auVar38);
              _local_328 = vblendvps_avx(_local_328,local_f8,auVar38);
              _local_338 = vblendvps_avx(_local_338,auVar187,auVar38);
              _local_348 = vblendvps_avx(_local_348,auVar238,auVar38);
              auVar331._0_4_ = local_388._0_4_;
              auVar331._4_4_ = auVar331._0_4_;
              auVar331._8_4_ = auVar331._0_4_;
              auVar331._12_4_ = auVar331._0_4_;
              auVar39 = vblendvps_avx(auVar284,auVar331,auVar38);
              in_ZMM10 = ZEXT1664(auVar39);
              auVar39 = vshufps_avx(_local_388,_local_388,0x55);
              _local_2b8 = vblendvps_avx(_local_2b8,auVar39,auVar38);
              auVar39 = vshufps_avx(_local_388,_local_388,0xaa);
              _local_268 = vblendvps_avx(_local_268,auVar39,auVar38);
              uVar23 = local_158._0_4_;
              auVar332._4_4_ = uVar23;
              auVar332._0_4_ = uVar23;
              auVar332._8_4_ = uVar23;
              auVar332._12_4_ = uVar23;
              _local_258 = vblendvps_avx(_local_258,auVar332,auVar38);
              auVar39 = vshufps_avx(local_158,local_158,0x55);
              _local_248 = vblendvps_avx(_local_248,auVar39,auVar38);
              auVar39 = vshufps_avx(local_158,local_158,0xaa);
              auVar25 = vblendvps_avx(auVar25,auVar39,auVar38);
              uVar23 = in_ZMM4._0_4_;
              auVar333._4_4_ = uVar23;
              auVar333._0_4_ = uVar23;
              auVar333._8_4_ = uVar23;
              auVar333._12_4_ = uVar23;
              auVar138 = vblendvps_avx(auVar138,auVar333,auVar38);
              auVar82 = in_ZMM4._0_16_;
              auVar39 = vshufps_avx(auVar82,auVar82,0x55);
              auVar39 = vblendvps_avx(_local_358,auVar39,auVar38);
              in_ZMM15 = ZEXT1664(auVar39);
              auVar39 = vshufps_avx(auVar82,auVar82,0xaa);
              _local_368 = vblendvps_avx(_local_368,auVar39,auVar38);
              uVar23 = in_ZMM13._0_4_;
              auVar334._4_4_ = uVar23;
              auVar334._0_4_ = uVar23;
              auVar334._8_4_ = uVar23;
              auVar334._12_4_ = uVar23;
              auVar39 = vblendvps_avx(_local_3a8,auVar334,auVar38);
              in_ZMM9 = ZEXT1664(auVar39);
              auVar82 = in_ZMM13._0_16_;
              auVar39 = vshufps_avx(auVar82,auVar82,0x55);
              auVar59 = vblendvps_avx(auVar59,auVar39,auVar38);
              auVar39 = vshufps_avx(auVar82,auVar82,0xaa);
              auVar81 = vblendvps_avx(auVar81,auVar39,auVar38);
              in_ZMM14 = ZEXT1664(auVar81);
              local_178._0_4_ = auVar265._0_4_;
              local_178._4_4_ = auVar265._4_4_;
              fStack_170 = auVar265._8_4_;
              fStack_16c = auVar265._12_4_;
              auVar265._0_4_ = local_178._0_4_ ^ auVar38._0_4_;
              auVar265._4_4_ = local_178._4_4_ ^ auVar38._4_4_;
              auVar265._8_4_ = (uint)fStack_170 ^ auVar38._8_4_;
              auVar265._12_4_ = (uint)fStack_16c ^ auVar38._12_4_;
              in_ZMM6 = ZEXT1664(auVar37);
            }
            _local_388 = auVar59;
          }
          auVar299._8_4_ = 0x3f800000;
          auVar299._0_8_ = 0x3f8000003f800000;
          auVar299._12_4_ = 0x3f800000;
          auVar37 = vsubps_avx(auVar299,auVar117);
          fVar137 = auVar117._0_4_;
          auVar285._0_4_ = fVar137 * auVar284._0_4_;
          fVar160 = auVar117._4_4_;
          auVar285._4_4_ = fVar160 * auVar284._4_4_;
          fVar161 = auVar117._8_4_;
          auVar285._8_4_ = fVar161 * auVar284._8_4_;
          fVar162 = auVar117._12_4_;
          auVar285._12_4_ = fVar162 * auVar284._12_4_;
          auVar38 = vfmadd231ps_fma(auVar285,auVar37,_local_2f8);
          auVar264._0_4_ = fVar137 * local_2b8._0_4_;
          auVar264._4_4_ = fVar160 * local_2b8._4_4_;
          auVar264._8_4_ = fVar161 * local_2b8._8_4_;
          auVar264._12_4_ = fVar162 * local_2b8._12_4_;
          auVar39 = vfmadd231ps_fma(auVar264,auVar37,_local_2e8);
          auVar231._0_4_ = fVar137 * local_268._0_4_;
          auVar231._4_4_ = fVar160 * local_268._4_4_;
          auVar231._8_4_ = fVar161 * local_268._8_4_;
          auVar231._12_4_ = fVar162 * local_268._12_4_;
          auVar117 = vfmadd231ps_fma(auVar231,auVar37,local_308);
          auVar164._0_4_ = fVar137 * (float)local_258._0_4_;
          auVar164._4_4_ = fVar160 * (float)local_258._4_4_;
          auVar164._8_4_ = fVar161 * fStack_250;
          auVar164._12_4_ = fVar162 * fStack_24c;
          auVar59 = vfmadd231ps_fma(auVar164,auVar37,local_378);
          auVar116._0_4_ = fVar137 * local_248._0_4_;
          auVar116._4_4_ = fVar160 * local_248._4_4_;
          auVar116._8_4_ = fVar161 * local_248._8_4_;
          auVar116._12_4_ = fVar162 * local_248._12_4_;
          auVar82 = vfmadd231ps_fma(auVar116,auVar37,_local_398);
          auVar33._0_4_ = fVar137 * auVar25._0_4_;
          auVar33._4_4_ = fVar160 * auVar25._4_4_;
          auVar33._8_4_ = fVar161 * auVar25._8_4_;
          auVar33._12_4_ = fVar162 * auVar25._12_4_;
          auVar25 = vfmadd231ps_fma(auVar33,auVar37,_local_2d8);
          auVar139._0_4_ = fVar137 * auVar138._0_4_;
          auVar139._4_4_ = fVar160 * auVar138._4_4_;
          auVar139._8_4_ = fVar161 * auVar138._8_4_;
          auVar139._12_4_ = fVar162 * auVar138._12_4_;
          auVar83 = vfmadd231ps_fma(auVar139,auVar37,local_2a8);
          auVar340._0_4_ = fVar137 * (float)local_358._0_4_;
          auVar340._4_4_ = fVar160 * (float)local_358._4_4_;
          auVar340._8_4_ = fVar161 * fStack_350;
          auVar340._12_4_ = fVar162 * fStack_34c;
          auVar84 = vfmadd231ps_fma(auVar340,auVar37,_local_238);
          auVar319._0_4_ = fVar137 * (float)local_368._0_4_;
          auVar319._4_4_ = fVar160 * (float)local_368._4_4_;
          auVar319._8_4_ = fVar161 * fStack_360;
          auVar319._12_4_ = fVar162 * fStack_35c;
          auVar85 = vfmadd231ps_fma(auVar319,auVar37,local_318);
          auVar276._0_4_ = fVar137 * (float)local_3a8._0_4_;
          auVar276._4_4_ = fVar160 * (float)local_3a8._4_4_;
          auVar276._8_4_ = fVar161 * fStack_3a0;
          auVar276._12_4_ = fVar162 * fStack_39c;
          auVar300._0_4_ = fVar137 * (float)local_388._0_4_;
          auVar300._4_4_ = fVar160 * (float)local_388._4_4_;
          auVar300._8_4_ = fVar161 * fStack_380;
          auVar300._12_4_ = fVar162 * fStack_37c;
          auVar309._0_4_ = fVar137 * auVar81._0_4_;
          auVar309._4_4_ = fVar160 * auVar81._4_4_;
          auVar309._8_4_ = fVar161 * auVar81._8_4_;
          auVar309._12_4_ = fVar162 * auVar81._12_4_;
          auVar86 = vfmadd231ps_fma(auVar276,auVar37,_local_328);
          auVar187 = vfmadd231ps_fma(auVar300,auVar37,_local_338);
          auVar238 = vfmadd231ps_fma(auVar309,auVar37,_local_348);
          auVar58._0_4_ = auVar84._0_4_ * auVar25._0_4_;
          auVar58._4_4_ = auVar84._4_4_ * auVar25._4_4_;
          auVar58._8_4_ = auVar84._8_4_ * auVar25._8_4_;
          auVar58._12_4_ = auVar84._12_4_ * auVar25._12_4_;
          auVar81 = vfmsub231ps_fma(auVar58,auVar82,auVar85);
          auVar207._0_4_ = auVar85._0_4_ * auVar59._0_4_;
          auVar207._4_4_ = auVar85._4_4_ * auVar59._4_4_;
          auVar207._8_4_ = auVar85._8_4_ * auVar59._8_4_;
          auVar207._12_4_ = auVar85._12_4_ * auVar59._12_4_;
          auVar291 = vfmsub231ps_fma(auVar207,auVar25,auVar83);
          auVar246._0_4_ = auVar83._0_4_ * auVar82._0_4_;
          auVar246._4_4_ = auVar83._4_4_ * auVar82._4_4_;
          auVar246._8_4_ = auVar83._8_4_ * auVar82._8_4_;
          auVar246._12_4_ = auVar83._12_4_ * auVar82._12_4_;
          auVar343 = vfmsub231ps_fma(auVar246,auVar59,auVar84);
          fVar137 = auVar117._0_4_;
          auVar327._0_4_ = fVar137 * auVar83._0_4_;
          fVar160 = auVar117._4_4_;
          auVar327._4_4_ = fVar160 * auVar83._4_4_;
          fVar161 = auVar117._8_4_;
          auVar327._8_4_ = fVar161 * auVar83._8_4_;
          fVar162 = auVar117._12_4_;
          auVar327._12_4_ = fVar162 * auVar83._12_4_;
          auVar87 = vfmsub231ps_fma(auVar327,auVar38,auVar85);
          auVar320._0_4_ = auVar39._0_4_ * auVar85._0_4_;
          auVar320._4_4_ = auVar39._4_4_ * auVar85._4_4_;
          auVar320._8_4_ = auVar39._8_4_ * auVar85._8_4_;
          auVar320._12_4_ = auVar39._12_4_ * auVar85._12_4_;
          auVar85 = vfmsub231ps_fma(auVar320,auVar84,auVar117);
          auVar341._0_4_ = auVar38._0_4_ * auVar84._0_4_;
          auVar341._4_4_ = auVar38._4_4_ * auVar84._4_4_;
          auVar341._8_4_ = auVar38._8_4_ * auVar84._8_4_;
          auVar341._12_4_ = auVar38._12_4_ * auVar84._12_4_;
          auVar83 = vfmsub231ps_fma(auVar341,auVar39,auVar83);
          auVar140._0_4_ = auVar82._0_4_ * fVar137;
          auVar140._4_4_ = auVar82._4_4_ * fVar160;
          auVar140._8_4_ = auVar82._8_4_ * fVar161;
          auVar140._12_4_ = auVar82._12_4_ * fVar162;
          auVar84 = vfmsub231ps_fma(auVar140,auVar39,auVar25);
          auVar34._0_4_ = auVar38._0_4_ * auVar25._0_4_;
          auVar34._4_4_ = auVar38._4_4_ * auVar25._4_4_;
          auVar34._8_4_ = auVar38._8_4_ * auVar25._8_4_;
          auVar34._12_4_ = auVar38._12_4_ * auVar25._12_4_;
          auVar117 = vfmsub231ps_fma(auVar34,auVar117,auVar59);
          auVar165._0_4_ = auVar39._0_4_ * auVar59._0_4_;
          auVar165._4_4_ = auVar39._4_4_ * auVar59._4_4_;
          auVar165._8_4_ = auVar39._8_4_ * auVar59._8_4_;
          auVar165._12_4_ = auVar39._12_4_ * auVar59._12_4_;
          auVar59 = vfmsub231ps_fma(auVar165,auVar38,auVar82);
          auVar232._0_4_ = fVar137 * auVar343._0_4_;
          auVar232._4_4_ = fVar160 * auVar343._4_4_;
          auVar232._8_4_ = fVar161 * auVar343._8_4_;
          auVar232._12_4_ = fVar162 * auVar343._12_4_;
          auVar37 = vfmadd231ps_fma(auVar232,auVar291,auVar39);
          auVar39 = vfmadd231ps_fma(auVar37,auVar81,auVar38);
          auVar37 = vdivps_avx(auVar81,auVar39);
          _local_368 = vdivps_avx(auVar85,auVar39);
          _local_3a8 = vdivps_avx(auVar84,auVar39);
          auVar81 = vdivps_avx(auVar291,auVar39);
          auVar25 = vdivps_avx(auVar87,auVar39);
          _local_398 = vdivps_avx(auVar117,auVar39);
          local_378 = vdivps_avx(auVar343,auVar39);
          auVar38 = vdivps_avx(auVar83,auVar39);
          auVar39 = vdivps_avx(auVar59,auVar39);
          fVar137 = auVar238._0_4_;
          auVar35._0_4_ = fVar137 * local_378._0_4_;
          fVar160 = auVar238._4_4_;
          auVar35._4_4_ = fVar160 * local_378._4_4_;
          fVar161 = auVar238._8_4_;
          auVar35._8_4_ = fVar161 * local_378._8_4_;
          fVar162 = auVar238._12_4_;
          auVar35._12_4_ = fVar162 * local_378._12_4_;
          auVar166._0_4_ = fVar137 * auVar38._0_4_;
          auVar166._4_4_ = fVar160 * auVar38._4_4_;
          auVar166._8_4_ = fVar161 * auVar38._8_4_;
          auVar166._12_4_ = fVar162 * auVar38._12_4_;
          auVar310._0_4_ = fVar137 * auVar39._0_4_;
          auVar310._4_4_ = fVar160 * auVar39._4_4_;
          auVar310._8_4_ = fVar161 * auVar39._8_4_;
          auVar310._12_4_ = fVar162 * auVar39._12_4_;
          auVar117 = vfmadd231ps_fma(auVar35,auVar187,auVar81);
          auVar59 = vfmadd231ps_fma(auVar166,auVar187,auVar25);
          auVar82 = vfmadd231ps_fma(auVar310,_local_398,auVar187);
          auVar117 = vfmadd231ps_fma(auVar117,auVar86,auVar37);
          auVar59 = vfmadd231ps_fma(auVar59,auVar86,_local_368);
          auVar82 = vfmadd231ps_fma(auVar82,_local_3a8,auVar86);
          auVar301._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
          auVar301._8_4_ = auVar117._8_4_ ^ 0x80000000;
          auVar301._12_4_ = auVar117._12_4_ ^ 0x80000000;
          auVar286._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
          auVar286._8_4_ = auVar59._8_4_ ^ 0x80000000;
          auVar286._12_4_ = auVar59._12_4_ ^ 0x80000000;
          auVar277._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
          auVar277._8_4_ = auVar82._8_4_ ^ 0x80000000;
          auVar277._12_4_ = auVar82._12_4_ ^ 0x80000000;
        }
        auVar117 = *(undefined1 (*) [16])ray;
        auVar59 = *(undefined1 (*) [16])(ray + 0x10);
        auVar82 = *(undefined1 (*) [16])(ray + 0x20);
        auVar83 = vfmadd231ps_fma(auVar301,auVar82,local_378);
        auVar83 = vfmadd231ps_fma(auVar83,auVar59,auVar81);
        auVar86 = vfmadd231ps_fma(auVar83,auVar117,auVar37);
        auVar83 = *(undefined1 (*) [16])(ray + 0x40);
        auVar84 = *(undefined1 (*) [16])(ray + 0x50);
        auVar85 = *(undefined1 (*) [16])(ray + 0x60);
        *(undefined1 (*) [16])ray = auVar86;
        auVar86 = vfmadd231ps_fma(auVar286,auVar82,auVar38);
        auVar86 = vfmadd231ps_fma(auVar86,auVar59,auVar25);
        auVar86 = vfmadd231ps_fma(auVar86,auVar117,_local_368);
        *(undefined1 (*) [16])(ray + 0x10) = auVar86;
        auVar86 = vfmadd231ps_fma(auVar277,auVar82,auVar39);
        auVar86 = vfmadd231ps_fma(auVar86,auVar59,_local_398);
        auVar86 = vfmadd231ps_fma(auVar86,auVar117,_local_3a8);
        *(undefined1 (*) [16])(ray + 0x20) = auVar86;
        fVar137 = auVar85._0_4_;
        auVar36._0_4_ = local_378._0_4_ * fVar137;
        fVar160 = auVar85._4_4_;
        auVar36._4_4_ = local_378._4_4_ * fVar160;
        fVar161 = auVar85._8_4_;
        auVar36._8_4_ = local_378._8_4_ * fVar161;
        fVar162 = auVar85._12_4_;
        auVar36._12_4_ = local_378._12_4_ * fVar162;
        auVar81 = vfmadd231ps_fma(auVar36,auVar84,auVar81);
        auVar167._0_4_ = auVar38._0_4_ * fVar137;
        auVar167._4_4_ = auVar38._4_4_ * fVar160;
        auVar167._8_4_ = auVar38._8_4_ * fVar161;
        auVar167._12_4_ = auVar38._12_4_ * fVar162;
        auVar38 = vfmadd231ps_fma(auVar167,auVar84,auVar25);
        auVar208._0_4_ = auVar39._0_4_ * fVar137;
        auVar208._4_4_ = auVar39._4_4_ * fVar160;
        auVar208._8_4_ = auVar39._8_4_ * fVar161;
        auVar208._12_4_ = auVar39._12_4_ * fVar162;
        auVar39 = vfmadd231ps_fma(auVar208,auVar84,_local_398);
        auVar37 = vfmadd231ps_fma(auVar81,auVar83,auVar37);
        auVar81 = vfmadd231ps_fma(auVar38,auVar83,_local_368);
        auVar38 = vfmadd231ps_fma(auVar39,auVar83,_local_3a8);
        *(undefined1 (*) [16])(ray + 0x40) = auVar37;
        *(undefined1 (*) [16])(ray + 0x50) = auVar81;
        *(undefined1 (*) [16])(ray + 0x60) = auVar38;
        local_c8 = context->args;
        local_48 = local_58._0_8_;
        uStack_40 = local_58._8_8_;
        local_d8._8_8_ = pRVar5;
        local_d8._0_8_ = pAVar18;
        local_58 = auVar24;
        (**(code **)&pAVar18->field_0xa0)(&local_48,&(pAVar18->super_AccelData).field_0x58,ray);
        local_318._0_8_ = auVar117._0_8_;
        local_318._8_8_ = auVar117._8_8_;
        *(undefined8 *)ray = local_318._0_8_;
        *(undefined8 *)(ray + 8) = local_318._8_8_;
        local_308._0_8_ = auVar59._0_8_;
        local_308._8_8_ = auVar59._8_8_;
        *(undefined8 *)(ray + 0x10) = local_308._0_8_;
        *(undefined8 *)(ray + 0x18) = local_308._8_8_;
        local_378._0_8_ = auVar82._0_8_;
        local_378._8_8_ = auVar82._8_8_;
        *(undefined8 *)(ray + 0x20) = local_378._0_8_;
        *(undefined8 *)(ray + 0x28) = local_378._8_8_;
        local_348 = auVar83._0_8_;
        uStack_340 = auVar83._8_8_;
        *(undefined1 (*) [8])(ray + 0x40) = local_348;
        *(undefined8 *)(ray + 0x48) = uStack_340;
        local_338 = auVar84._0_8_;
        uStack_330 = auVar84._8_8_;
        *(undefined1 (*) [8])(ray + 0x50) = local_338;
        *(undefined8 *)(ray + 0x58) = uStack_330;
        local_328 = auVar85._0_8_;
        uStack_320 = auVar85._8_8_;
        *(undefined1 (*) [8])(ray + 0x60) = local_328;
        *(undefined8 *)(ray + 0x68) = uStack_320;
        auVar37 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
        *(undefined1 (*) [16])this = auVar37;
        pRVar5->instID[0] = 0xffffffff;
        pRVar5->instPrimID[0] = 0xffffffff;
        uVar21 = extraout_RDX_00;
      }
      goto LAB_0171b3ec;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar17;
LAB_0171b3ec:
  vVar351.field_0._8_8_ = uVar21;
  vVar351.field_0._0_8_ = this;
  return (vbool<4>)vVar351.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }